

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  bool bVar22;
  bool bVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  byte bVar29;
  uint uVar30;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar53 [16];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  float fVar92;
  undefined4 uVar93;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  float t1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 a0_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vfloat4 a0_3;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  __m128 a_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  __m128 a;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar197;
  float fVar198;
  vfloat4 a0_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar199;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar211;
  float fVar212;
  vfloat4 a0;
  undefined1 auVar204 [16];
  float fVar213;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_340;
  float local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  long local_308;
  Primitive *local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  RayQueryContext *local_250;
  ulong local_248;
  ulong local_240;
  RTCFilterFunctionNArguments local_238;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  uint auStack_168 [4];
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_14c;
  undefined4 local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar31;
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar222 [32];
  
  PVar4 = prim[1];
  uVar26 = (ulong)(byte)PVar4;
  fVar202 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar74._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,
                  *(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar111 = fVar202 * auVar74._16_4_;
  fVar92 = fVar202 * (ray->dir).field_0.m128[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar61 = vpmovsxbd_avx2(auVar37);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar59 = vpmovsxbd_avx2(auVar47);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar66 = vpmovsxbd_avx2(auVar48);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar76 = vpmovsxbd_avx2(auVar49);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar70 = vpmovsxbd_avx2(auVar43);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77 = vcvtdq2ps_avx(auVar70);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar26 + 6);
  auVar60 = vpmovsxbd_avx2(auVar39);
  auVar60 = vcvtdq2ps_avx(auVar60);
  uVar27 = (ulong)(uint)((int)(uVar26 * 9) * 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar27 + 6);
  auVar67 = vpmovsxbd_avx2(auVar38);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar27 + uVar26 + 6);
  auVar68 = vpmovsxbd_avx2(auVar40);
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar24 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar24 + 6);
  auVar58 = vpmovsxbd_avx2(auVar41);
  auVar69 = vcvtdq2ps_avx(auVar58);
  auVar217._4_4_ = fVar92;
  auVar217._0_4_ = fVar92;
  auVar217._8_4_ = fVar92;
  auVar217._12_4_ = fVar92;
  auVar217._16_4_ = fVar92;
  auVar217._20_4_ = fVar92;
  auVar217._24_4_ = fVar92;
  auVar217._28_4_ = fVar92;
  auVar228._8_4_ = 1;
  auVar228._0_8_ = 0x100000001;
  auVar228._12_4_ = 1;
  auVar228._16_4_ = 1;
  auVar228._20_4_ = 1;
  auVar228._24_4_ = 1;
  auVar228._28_4_ = 1;
  auVar56 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar72 = ZEXT1632(CONCAT412(fVar202 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar202 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar202 * (ray->dir).field_0.m128[1],fVar92))));
  auVar71 = vpermps_avx2(auVar228,auVar72);
  auVar57 = vpermps_avx512vl(auVar56,auVar72);
  fVar92 = auVar57._0_4_;
  fVar197 = auVar57._4_4_;
  auVar72._4_4_ = fVar197 * auVar66._4_4_;
  auVar72._0_4_ = fVar92 * auVar66._0_4_;
  fVar198 = auVar57._8_4_;
  auVar72._8_4_ = fVar198 * auVar66._8_4_;
  fVar199 = auVar57._12_4_;
  auVar72._12_4_ = fVar199 * auVar66._12_4_;
  fVar200 = auVar57._16_4_;
  auVar72._16_4_ = fVar200 * auVar66._16_4_;
  fVar201 = auVar57._20_4_;
  auVar72._20_4_ = fVar201 * auVar66._20_4_;
  fVar101 = auVar57._24_4_;
  auVar72._24_4_ = fVar101 * auVar66._24_4_;
  auVar72._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar60._4_4_ * fVar197;
  auVar70._0_4_ = auVar60._0_4_ * fVar92;
  auVar70._8_4_ = auVar60._8_4_ * fVar198;
  auVar70._12_4_ = auVar60._12_4_ * fVar199;
  auVar70._16_4_ = auVar60._16_4_ * fVar200;
  auVar70._20_4_ = auVar60._20_4_ * fVar201;
  auVar70._24_4_ = auVar60._24_4_ * fVar101;
  auVar70._28_4_ = auVar58._28_4_;
  auVar58._4_4_ = auVar69._4_4_ * fVar197;
  auVar58._0_4_ = auVar69._0_4_ * fVar92;
  auVar58._8_4_ = auVar69._8_4_ * fVar198;
  auVar58._12_4_ = auVar69._12_4_ * fVar199;
  auVar58._16_4_ = auVar69._16_4_ * fVar200;
  auVar58._20_4_ = auVar69._20_4_ * fVar201;
  auVar58._24_4_ = auVar69._24_4_ * fVar101;
  auVar58._28_4_ = auVar57._28_4_;
  auVar37 = vfmadd231ps_fma(auVar72,auVar71,auVar59);
  auVar47 = vfmadd231ps_fma(auVar70,auVar71,auVar77);
  auVar48 = vfmadd231ps_fma(auVar58,auVar68,auVar71);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar217,auVar61);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar217,auVar76);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar67,auVar217);
  auVar218._4_4_ = fVar111;
  auVar218._0_4_ = fVar111;
  auVar218._8_4_ = fVar111;
  auVar218._12_4_ = fVar111;
  auVar218._16_4_ = fVar111;
  auVar218._20_4_ = fVar111;
  auVar218._24_4_ = fVar111;
  auVar218._28_4_ = fVar111;
  auVar58 = ZEXT1632(CONCAT412(fVar202 * auVar74._28_4_,
                               CONCAT48(fVar202 * auVar74._24_4_,
                                        CONCAT44(fVar202 * auVar74._20_4_,fVar111))));
  auVar70 = vpermps_avx2(auVar228,auVar58);
  auVar58 = vpermps_avx512vl(auVar56,auVar58);
  fVar202 = auVar58._0_4_;
  fVar92 = auVar58._4_4_;
  auVar71._4_4_ = fVar92 * auVar66._4_4_;
  auVar71._0_4_ = fVar202 * auVar66._0_4_;
  fVar197 = auVar58._8_4_;
  auVar71._8_4_ = fVar197 * auVar66._8_4_;
  fVar198 = auVar58._12_4_;
  auVar71._12_4_ = fVar198 * auVar66._12_4_;
  fVar199 = auVar58._16_4_;
  auVar71._16_4_ = fVar199 * auVar66._16_4_;
  fVar200 = auVar58._20_4_;
  auVar71._20_4_ = fVar200 * auVar66._20_4_;
  fVar201 = auVar58._24_4_;
  auVar71._24_4_ = fVar201 * auVar66._24_4_;
  auVar71._28_4_ = 1;
  auVar56._4_4_ = auVar60._4_4_ * fVar92;
  auVar56._0_4_ = auVar60._0_4_ * fVar202;
  auVar56._8_4_ = auVar60._8_4_ * fVar197;
  auVar56._12_4_ = auVar60._12_4_ * fVar198;
  auVar56._16_4_ = auVar60._16_4_ * fVar199;
  auVar56._20_4_ = auVar60._20_4_ * fVar200;
  auVar56._24_4_ = auVar60._24_4_ * fVar201;
  auVar56._28_4_ = auVar66._28_4_;
  auVar60._4_4_ = auVar69._4_4_ * fVar92;
  auVar60._0_4_ = auVar69._0_4_ * fVar202;
  auVar60._8_4_ = auVar69._8_4_ * fVar197;
  auVar60._12_4_ = auVar69._12_4_ * fVar198;
  auVar60._16_4_ = auVar69._16_4_ * fVar199;
  auVar60._20_4_ = auVar69._20_4_ * fVar200;
  auVar60._24_4_ = auVar69._24_4_ * fVar201;
  auVar60._28_4_ = auVar58._28_4_;
  auVar49 = vfmadd231ps_fma(auVar71,auVar70,auVar59);
  auVar43 = vfmadd231ps_fma(auVar56,auVar70,auVar77);
  auVar39 = vfmadd231ps_fma(auVar60,auVar70,auVar68);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar218,auVar61);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar218,auVar76);
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar80._16_4_ = 0x7fffffff;
  auVar80._20_4_ = 0x7fffffff;
  auVar80._24_4_ = 0x7fffffff;
  auVar80._28_4_ = 0x7fffffff;
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar218,auVar67);
  auVar61 = vandps_avx(ZEXT1632(auVar37),auVar80);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar133._16_4_ = 0x219392ef;
  auVar133._20_4_ = 0x219392ef;
  auVar133._24_4_ = 0x219392ef;
  auVar133._28_4_ = 0x219392ef;
  uVar27 = vcmpps_avx512vl(auVar61,auVar133,1);
  bVar23 = (bool)((byte)uVar27 & 1);
  auVar57._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._0_4_;
  bVar23 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._4_4_;
  bVar23 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._8_4_;
  bVar23 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._12_4_;
  auVar57._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * 0x219392ef;
  auVar57._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * 0x219392ef;
  auVar57._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * 0x219392ef;
  auVar57._28_4_ = (uint)(byte)(uVar27 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar47),auVar80);
  uVar27 = vcmpps_avx512vl(auVar61,auVar133,1);
  bVar23 = (bool)((byte)uVar27 & 1);
  auVar73._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar47._0_4_;
  bVar23 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar47._4_4_;
  bVar23 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar47._8_4_;
  bVar23 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar47._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar27 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar48),auVar80);
  uVar27 = vcmpps_avx512vl(auVar61,auVar133,1);
  bVar23 = (bool)((byte)uVar27 & 1);
  auVar61._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar48._0_4_;
  bVar23 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar48._4_4_;
  bVar23 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar48._8_4_;
  bVar23 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar48._12_4_;
  auVar61._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * 0x219392ef;
  auVar61._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * 0x219392ef;
  auVar61._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * 0x219392ef;
  auVar61._28_4_ = (uint)(byte)(uVar27 >> 7) * 0x219392ef;
  auVar59 = vrcp14ps_avx512vl(auVar57);
  auVar122._8_4_ = 0x3f800000;
  auVar122._0_8_ = 0x3f8000003f800000;
  auVar122._12_4_ = 0x3f800000;
  auVar122._16_4_ = 0x3f800000;
  auVar122._20_4_ = 0x3f800000;
  auVar122._24_4_ = 0x3f800000;
  auVar122._28_4_ = 0x3f800000;
  auVar37 = vfnmadd213ps_fma(auVar57,auVar59,auVar122);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar73);
  auVar47 = vfnmadd213ps_fma(auVar73,auVar59,auVar122);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar61);
  auVar48 = vfnmadd213ps_fma(auVar61,auVar59,auVar122);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar59,auVar59);
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar49));
  auVar67._4_4_ = auVar37._4_4_ * auVar61._4_4_;
  auVar67._0_4_ = auVar37._0_4_ * auVar61._0_4_;
  auVar67._8_4_ = auVar37._8_4_ * auVar61._8_4_;
  auVar67._12_4_ = auVar37._12_4_ * auVar61._12_4_;
  auVar67._16_4_ = auVar61._16_4_ * 0.0;
  auVar67._20_4_ = auVar61._20_4_ * 0.0;
  auVar67._24_4_ = auVar61._24_4_ * 0.0;
  auVar67._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar49));
  auVar60 = vpbroadcastd_avx512vl();
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar79._0_4_ = auVar37._0_4_ * auVar61._0_4_;
  auVar79._4_4_ = auVar37._4_4_ * auVar61._4_4_;
  auVar79._8_4_ = auVar37._8_4_ * auVar61._8_4_;
  auVar79._12_4_ = auVar37._12_4_ * auVar61._12_4_;
  auVar79._16_4_ = auVar61._16_4_ * 0.0;
  auVar79._20_4_ = auVar61._20_4_ * 0.0;
  auVar79._24_4_ = auVar61._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar26 * -2 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar43));
  auVar68._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar68._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar68._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar68._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar68._16_4_ = auVar61._16_4_ * 0.0;
  auVar68._20_4_ = auVar61._20_4_ * 0.0;
  auVar68._24_4_ = auVar61._24_4_ * 0.0;
  auVar68._28_4_ = auVar61._28_4_;
  auVar61 = vcvtdq2ps_avx(auVar59);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar43));
  auVar78._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar78._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar78._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar78._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar78._16_4_ = auVar61._16_4_ * 0.0;
  auVar78._20_4_ = auVar61._20_4_ * 0.0;
  auVar78._24_4_ = auVar61._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 + uVar26 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar39));
  auVar69._4_4_ = auVar61._4_4_ * auVar48._4_4_;
  auVar69._0_4_ = auVar61._0_4_ * auVar48._0_4_;
  auVar69._8_4_ = auVar61._8_4_ * auVar48._8_4_;
  auVar69._12_4_ = auVar61._12_4_ * auVar48._12_4_;
  auVar69._16_4_ = auVar61._16_4_ * 0.0;
  auVar69._20_4_ = auVar61._20_4_ * 0.0;
  auVar69._24_4_ = auVar61._24_4_ * 0.0;
  auVar69._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar39));
  auVar75._0_4_ = auVar48._0_4_ * auVar61._0_4_;
  auVar75._4_4_ = auVar48._4_4_ * auVar61._4_4_;
  auVar75._8_4_ = auVar48._8_4_ * auVar61._8_4_;
  auVar75._12_4_ = auVar48._12_4_ * auVar61._12_4_;
  auVar75._16_4_ = auVar61._16_4_ * 0.0;
  auVar75._20_4_ = auVar61._20_4_ * 0.0;
  auVar75._24_4_ = auVar61._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar61 = vpminsd_avx2(auVar67,auVar79);
  auVar59 = vpminsd_avx2(auVar68,auVar78);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59 = vpminsd_avx2(auVar69,auVar75);
  uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar66._4_4_ = uVar93;
  auVar66._0_4_ = uVar93;
  auVar66._8_4_ = uVar93;
  auVar66._12_4_ = uVar93;
  auVar66._16_4_ = uVar93;
  auVar66._20_4_ = uVar93;
  auVar66._24_4_ = uVar93;
  auVar66._28_4_ = uVar93;
  auVar59 = vmaxps_avx512vl(auVar59,auVar66);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  auVar59._16_4_ = 0x3f7ffffa;
  auVar59._20_4_ = 0x3f7ffffa;
  auVar59._24_4_ = 0x3f7ffffa;
  auVar59._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar61,auVar59);
  auVar61 = vpmaxsd_avx2(auVar67,auVar79);
  auVar59 = vpmaxsd_avx2(auVar68,auVar78);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar59 = vpmaxsd_avx2(auVar69,auVar75);
  fVar202 = ray->tfar;
  auVar76._4_4_ = fVar202;
  auVar76._0_4_ = fVar202;
  auVar76._8_4_ = fVar202;
  auVar76._12_4_ = fVar202;
  auVar76._16_4_ = fVar202;
  auVar76._20_4_ = fVar202;
  auVar76._24_4_ = fVar202;
  auVar76._28_4_ = fVar202;
  auVar59 = vminps_avx512vl(auVar59,auVar76);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar77._8_4_ = 0x3f800003;
  auVar77._0_8_ = 0x3f8000033f800003;
  auVar77._12_4_ = 0x3f800003;
  auVar77._16_4_ = 0x3f800003;
  auVar77._20_4_ = 0x3f800003;
  auVar77._24_4_ = 0x3f800003;
  auVar77._28_4_ = 0x3f800003;
  auVar61 = vmulps_avx512vl(auVar61,auVar77);
  uVar11 = vpcmpgtd_avx512vl(auVar60,_DAT_01fe9900);
  uVar10 = vcmpps_avx512vl(local_78,auVar61,2);
  if ((byte)((byte)uVar10 & (byte)uVar11) == 0) {
    return false;
  }
  local_240 = (ulong)(byte)((byte)uVar10 & (byte)uVar11);
  auVar74._16_16_ = auVar61._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar229 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar230 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar231 = ZEXT1664(auVar37);
  auVar239 = ZEXT464(0x3f800000);
LAB_01cfb431:
  lVar28 = 0;
  for (uVar27 = local_240; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar32 = *(uint *)(prim + 2);
  local_248 = (ulong)*(uint *)(prim + lVar28 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar32].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_248 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar37 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar27);
  lVar28 = uVar27 + 1;
  auVar47 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar28);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar48 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar27);
  auVar49 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar28);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar39 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar27),
                       auVar37,auVar38);
  auVar40 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar28),
                       auVar47,auVar38);
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar27 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar48,auVar38);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar28),
                       auVar49,auVar38);
  auVar63._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar43 = vmulps_avx512vl(auVar47,auVar63._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar43,auVar40,auVar63._0_16_);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar44);
  auVar52._0_4_ = auVar37._0_4_ + auVar43._0_4_;
  auVar52._4_4_ = auVar37._4_4_ + auVar43._4_4_;
  auVar52._8_4_ = auVar37._8_4_ + auVar43._8_4_;
  auVar52._12_4_ = auVar37._12_4_ + auVar43._12_4_;
  auVar53 = auVar229._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar44,auVar39,auVar53);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar37,auVar53);
  auVar43 = vmulps_avx512vl(auVar49,auVar63._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar63._0_16_);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar45);
  auVar204._0_4_ = auVar48._0_4_ + auVar43._0_4_;
  auVar204._4_4_ = auVar48._4_4_ + auVar43._4_4_;
  auVar204._8_4_ = auVar48._8_4_ + auVar43._8_4_;
  auVar204._12_4_ = auVar48._12_4_ + auVar43._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar41,auVar53);
  auVar45 = vfnmadd231ps_avx512vl(auVar43,auVar48,auVar53);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar39,auVar63._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar43,auVar37,auVar63._0_16_);
  auVar47 = vmulps_avx512vl(auVar47,auVar53);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar53,auVar40);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar63._0_16_,auVar39);
  auVar40 = vfnmadd231ps_avx512vl(auVar47,auVar63._0_16_,auVar37);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar49);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar41,auVar63._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar63._0_16_);
  auVar37 = vmulps_avx512vl(auVar49,auVar53);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar53,auVar42);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar63._0_16_,auVar41);
  auVar39 = vfnmadd231ps_avx512vl(auVar37,auVar63._0_16_,auVar48);
  auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar47 = vshufps_avx(auVar204,auVar204,0xc9);
  fVar111 = auVar44._0_4_;
  auVar136._0_4_ = fVar111 * auVar47._0_4_;
  fVar98 = auVar44._4_4_;
  auVar136._4_4_ = fVar98 * auVar47._4_4_;
  fVar99 = auVar44._8_4_;
  auVar136._8_4_ = fVar99 * auVar47._8_4_;
  fVar100 = auVar44._12_4_;
  auVar136._12_4_ = fVar100 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar136,auVar37,auVar204);
  auVar48 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar154._0_4_ = auVar47._0_4_ * fVar111;
  auVar154._4_4_ = auVar47._4_4_ * fVar98;
  auVar154._8_4_ = auVar47._8_4_ * fVar99;
  auVar154._12_4_ = auVar47._12_4_ * fVar100;
  auVar37 = vfmsub231ps_fma(auVar154,auVar37,auVar45);
  auVar49 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar47 = vshufps_avx(auVar43,auVar43,0xc9);
  fVar202 = auVar40._0_4_;
  auVar163._0_4_ = auVar47._0_4_ * fVar202;
  fVar92 = auVar40._4_4_;
  auVar163._4_4_ = auVar47._4_4_ * fVar92;
  fVar197 = auVar40._8_4_;
  auVar163._8_4_ = auVar47._8_4_ * fVar197;
  fVar198 = auVar40._12_4_;
  auVar163._12_4_ = auVar47._12_4_ * fVar198;
  auVar47 = vfmsub231ps_fma(auVar163,auVar37,auVar43);
  auVar43 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar164._0_4_ = auVar47._0_4_ * fVar202;
  auVar164._4_4_ = auVar47._4_4_ * fVar92;
  auVar164._8_4_ = auVar47._8_4_ * fVar197;
  auVar164._12_4_ = auVar47._12_4_ * fVar198;
  auVar37 = vfmsub231ps_fma(auVar164,auVar37,auVar39);
  auVar39 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar199 = auVar37._0_4_;
  auVar63._16_16_ = auVar74._16_16_;
  auVar62._4_28_ = auVar63._4_28_;
  auVar62._0_4_ = fVar199;
  auVar47 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
  fVar200 = auVar47._0_4_;
  fVar201 = fVar200 * 1.5 - fVar199 * 0.5 * fVar200 * fVar200 * fVar200;
  auVar47 = vdpps_avx(auVar48,auVar49,0x7f);
  fVar203 = fVar201 * auVar48._0_4_;
  fVar211 = fVar201 * auVar48._4_4_;
  fVar212 = fVar201 * auVar48._8_4_;
  fVar213 = fVar201 * auVar48._12_4_;
  auVar155._0_4_ = fVar199 * auVar49._0_4_;
  auVar155._4_4_ = fVar199 * auVar49._4_4_;
  auVar155._8_4_ = fVar199 * auVar49._8_4_;
  auVar155._12_4_ = fVar199 * auVar49._12_4_;
  fVar199 = auVar47._0_4_;
  auVar137._0_4_ = fVar199 * auVar48._0_4_;
  auVar137._4_4_ = fVar199 * auVar48._4_4_;
  auVar137._8_4_ = fVar199 * auVar48._8_4_;
  auVar137._12_4_ = fVar199 * auVar48._12_4_;
  auVar48 = vsubps_avx(auVar155,auVar137);
  auVar47 = vrcp14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar47,ZEXT416(0x40000000));
  fVar199 = auVar47._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar43,auVar43,0x7f);
  fVar200 = auVar37._0_4_;
  auVar65._16_16_ = auVar74._16_16_;
  auVar65._0_16_ = auVar63._0_16_;
  auVar64._4_28_ = auVar65._4_28_;
  auVar64._0_4_ = fVar200;
  auVar47 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
  fVar101 = auVar47._0_4_;
  fVar101 = fVar101 * 1.5 - fVar200 * 0.5 * fVar101 * fVar101 * fVar101;
  fVar176 = fVar101 * auVar43._0_4_;
  fVar184 = fVar101 * auVar43._4_4_;
  fVar185 = fVar101 * auVar43._8_4_;
  fVar186 = fVar101 * auVar43._12_4_;
  auVar47 = vdpps_avx(auVar43,auVar39,0x7f);
  auVar124._0_4_ = fVar200 * auVar39._0_4_;
  auVar124._4_4_ = fVar200 * auVar39._4_4_;
  auVar124._8_4_ = fVar200 * auVar39._8_4_;
  auVar124._12_4_ = fVar200 * auVar39._12_4_;
  fVar200 = auVar47._0_4_;
  auVar55._0_4_ = fVar200 * auVar43._0_4_;
  auVar55._4_4_ = fVar200 * auVar43._4_4_;
  auVar55._8_4_ = fVar200 * auVar43._8_4_;
  auVar55._12_4_ = fVar200 * auVar43._12_4_;
  auVar49 = vsubps_avx(auVar124,auVar55);
  auVar47 = vrcp14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar47,ZEXT416(0x40000000));
  fVar200 = auVar47._0_4_ * auVar37._0_4_;
  auVar37 = vshufps_avx(auVar52,auVar52,0xff);
  auVar146._0_4_ = fVar203 * auVar37._0_4_;
  auVar146._4_4_ = fVar211 * auVar37._4_4_;
  auVar146._8_4_ = fVar212 * auVar37._8_4_;
  auVar146._12_4_ = fVar213 * auVar37._12_4_;
  local_198 = vsubps_avx(auVar52,auVar146);
  auVar47 = vshufps_avx(auVar44,auVar44,0xff);
  auVar125._0_4_ = auVar47._0_4_ * fVar203 + auVar37._0_4_ * fVar201 * fVar199 * auVar48._0_4_;
  auVar125._4_4_ = auVar47._4_4_ * fVar211 + auVar37._4_4_ * fVar201 * fVar199 * auVar48._4_4_;
  auVar125._8_4_ = auVar47._8_4_ * fVar212 + auVar37._8_4_ * fVar201 * fVar199 * auVar48._8_4_;
  auVar125._12_4_ = auVar47._12_4_ * fVar213 + auVar37._12_4_ * fVar201 * fVar199 * auVar48._12_4_;
  auVar48 = vsubps_avx(auVar44,auVar125);
  local_1a8._0_4_ = auVar52._0_4_ + auVar146._0_4_;
  local_1a8._4_4_ = auVar52._4_4_ + auVar146._4_4_;
  fStack_1a0 = auVar52._8_4_ + auVar146._8_4_;
  fStack_19c = auVar52._12_4_ + auVar146._12_4_;
  auVar44._0_4_ = fVar111 + auVar125._0_4_;
  auVar44._4_4_ = fVar98 + auVar125._4_4_;
  auVar44._8_4_ = fVar99 + auVar125._8_4_;
  auVar44._12_4_ = fVar100 + auVar125._12_4_;
  auVar37 = vshufps_avx(auVar46,auVar46,0xff);
  auVar126._0_4_ = fVar176 * auVar37._0_4_;
  auVar126._4_4_ = fVar184 * auVar37._4_4_;
  auVar126._8_4_ = fVar185 * auVar37._8_4_;
  auVar126._12_4_ = fVar186 * auVar37._12_4_;
  local_1b8 = vsubps_avx(auVar46,auVar126);
  auVar47 = vshufps_avx(auVar40,auVar40,0xff);
  auVar53._0_4_ = fVar176 * auVar47._0_4_ + auVar37._0_4_ * fVar101 * auVar49._0_4_ * fVar200;
  auVar53._4_4_ = fVar184 * auVar47._4_4_ + auVar37._4_4_ * fVar101 * auVar49._4_4_ * fVar200;
  auVar53._8_4_ = fVar185 * auVar47._8_4_ + auVar37._8_4_ * fVar101 * auVar49._8_4_ * fVar200;
  auVar53._12_4_ = fVar186 * auVar47._12_4_ + auVar37._12_4_ * fVar101 * auVar49._12_4_ * fVar200;
  auVar37 = vsubps_avx(auVar40,auVar53);
  _local_1c8 = vaddps_avx512vl(auVar46,auVar126);
  auVar46._0_4_ = fVar202 + auVar53._0_4_;
  auVar46._4_4_ = fVar92 + auVar53._4_4_;
  auVar46._8_4_ = fVar197 + auVar53._8_4_;
  auVar46._12_4_ = fVar198 + auVar53._12_4_;
  auVar47 = vmulps_avx512vl(auVar48,auVar38);
  local_1d8 = vaddps_avx512vl(local_198,auVar47);
  auVar37 = vmulps_avx512vl(auVar37,auVar38);
  local_1e8 = vsubps_avx512vl(local_1b8,auVar37);
  auVar37 = vmulps_avx512vl(auVar44,auVar38);
  _local_1f8 = vaddps_avx512vl(_local_1a8,auVar37);
  auVar37 = vmulps_avx512vl(auVar46,auVar38);
  _local_208 = vsubps_avx512vl(_local_1c8,auVar37);
  aVar1 = (ray->org).field_0;
  auVar47 = vsubps_avx(local_198,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar102._4_4_ = uVar93;
  auVar102._0_4_ = uVar93;
  auVar102._8_4_ = uVar93;
  auVar102._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar202 = (pre->ray_space).vz.field_0.m128[0];
  fVar92 = (pre->ray_space).vz.field_0.m128[1];
  fVar197 = (pre->ray_space).vz.field_0.m128[2];
  fVar198 = (pre->ray_space).vz.field_0.m128[3];
  auVar45._0_4_ = fVar202 * auVar47._0_4_;
  auVar45._4_4_ = fVar92 * auVar47._4_4_;
  auVar45._8_4_ = fVar197 * auVar47._8_4_;
  auVar45._12_4_ = fVar198 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar37);
  auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar102);
  auVar47 = vsubps_avx512vl(local_1d8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar51._4_4_ = uVar93;
  auVar51._0_4_ = uVar93;
  auVar51._8_4_ = uVar93;
  auVar51._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar50._0_4_ = fVar202 * auVar47._0_4_;
  auVar50._4_4_ = fVar92 * auVar47._4_4_;
  auVar50._8_4_ = fVar197 * auVar47._8_4_;
  auVar50._12_4_ = fVar198 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar37);
  auVar39 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar51);
  auVar47 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar138._4_4_ = uVar93;
  auVar138._0_4_ = uVar93;
  auVar138._8_4_ = uVar93;
  auVar138._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar54._0_4_ = fVar202 * auVar47._0_4_;
  auVar54._4_4_ = fVar92 * auVar47._4_4_;
  auVar54._8_4_ = fVar197 * auVar47._8_4_;
  auVar54._12_4_ = fVar198 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar37);
  auVar38 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar138);
  auVar47 = vsubps_avx(local_1b8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar156._4_4_ = uVar93;
  auVar156._0_4_ = uVar93;
  auVar156._8_4_ = uVar93;
  auVar156._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar139._0_4_ = fVar202 * auVar47._0_4_;
  auVar139._4_4_ = fVar92 * auVar47._4_4_;
  auVar139._8_4_ = fVar197 * auVar47._8_4_;
  auVar139._12_4_ = fVar198 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar3,auVar37);
  auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar156);
  auVar47 = vsubps_avx(_local_1a8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar165._4_4_ = uVar93;
  auVar165._0_4_ = uVar93;
  auVar165._8_4_ = uVar93;
  auVar165._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar157._0_4_ = auVar47._0_4_ * fVar202;
  auVar157._4_4_ = auVar47._4_4_ * fVar92;
  auVar157._8_4_ = auVar47._8_4_ * fVar197;
  auVar157._12_4_ = auVar47._12_4_ * fVar198;
  auVar37 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar3,auVar37);
  auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar165);
  auVar47 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar177._4_4_ = uVar93;
  auVar177._0_4_ = uVar93;
  auVar177._8_4_ = uVar93;
  auVar177._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar166._0_4_ = auVar47._0_4_ * fVar202;
  auVar166._4_4_ = auVar47._4_4_ * fVar92;
  auVar166._8_4_ = auVar47._8_4_ * fVar197;
  auVar166._12_4_ = auVar47._12_4_ * fVar198;
  auVar37 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar3,auVar37);
  auVar74._16_16_ = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar177);
  auVar47 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar187._4_4_ = uVar93;
  auVar187._0_4_ = uVar93;
  auVar187._8_4_ = uVar93;
  auVar187._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar178._0_4_ = auVar47._0_4_ * fVar202;
  auVar178._4_4_ = auVar47._4_4_ * fVar92;
  auVar178._8_4_ = auVar47._8_4_ * fVar197;
  auVar178._12_4_ = auVar47._12_4_ * fVar198;
  auVar37 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar37);
  auVar42 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar187);
  auVar47 = vsubps_avx512vl(_local_1c8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar188._4_4_ = uVar93;
  auVar188._0_4_ = uVar93;
  auVar188._8_4_ = uVar93;
  auVar188._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar118._0_4_ = fVar202 * auVar47._0_4_;
  auVar118._4_4_ = fVar92 * auVar47._4_4_;
  auVar118._8_4_ = fVar197 * auVar47._8_4_;
  auVar118._12_4_ = fVar198 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar118,(undefined1  [16])aVar3,auVar37);
  auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar188);
  local_2f8 = vmovlhps_avx512f(auVar43,auVar41);
  auVar238 = ZEXT1664(local_2f8);
  local_318 = vmovlhps_avx512f(auVar39,auVar74._16_16_);
  auVar236 = ZEXT1664(local_318);
  local_268 = vmovlhps_avx(auVar38,auVar42);
  _local_178 = vmovlhps_avx512f(auVar40,auVar44);
  auVar37 = vminps_avx512vl(local_2f8,local_318);
  auVar48 = vmaxps_avx512vl(local_2f8,local_318);
  auVar47 = vminps_avx512vl(local_268,_local_178);
  auVar47 = vminps_avx(auVar37,auVar47);
  auVar37 = vmaxps_avx512vl(local_268,_local_178);
  auVar37 = vmaxps_avx(auVar48,auVar37);
  auVar48 = vshufpd_avx(auVar47,auVar47,3);
  auVar49 = vshufpd_avx(auVar37,auVar37,3);
  auVar47 = vminps_avx(auVar47,auVar48);
  auVar37 = vmaxps_avx(auVar37,auVar49);
  auVar47 = vandps_avx512vl(auVar47,auVar230._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar230._0_16_);
  auVar37 = vmaxps_avx(auVar47,auVar37);
  auVar47 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar47,auVar37);
  local_308 = local_240 + 0xff;
  local_278._8_8_ = auVar43._0_8_;
  local_278._0_8_ = auVar43._0_8_;
  local_288._8_8_ = auVar39._0_8_;
  local_288._0_8_ = auVar39._0_8_;
  local_298 = vmovddup_avx512vl(auVar38);
  local_2a8 = vmovddup_avx512vl(auVar40);
  register0x00001348 = auVar41._0_8_;
  local_2b8 = auVar41._0_8_;
  register0x00001388 = auVar74._16_8_;
  local_2c8 = auVar74._16_8_;
  register0x00001408 = auVar42._0_8_;
  local_2d8 = auVar42._0_8_;
  register0x00001448 = auVar44._0_8_;
  local_2e8 = auVar44._0_8_;
  local_188 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_188);
  auVar37 = vxorps_avx512vl(local_b8._0_16_,auVar231._0_16_);
  local_d8 = vbroadcastss_avx512vl(auVar37);
  local_328 = vsubps_avx512vl(local_318,local_2f8);
  local_338 = vsubps_avx512vl(local_268,local_318);
  local_e8 = vsubps_avx512vl(_local_178,local_268);
  local_f8 = vsubps_avx(_local_1a8,local_198);
  local_108 = vsubps_avx512vl(_local_1f8,local_1d8);
  local_118 = vsubps_avx512vl(_local_208,local_1e8);
  _local_128 = vsubps_avx512vl(_local_1c8,local_1b8);
  bVar23 = false;
  auVar37 = ZEXT816(0x3f80000000000000);
  uVar27 = 0;
  local_300 = prim;
  auVar42 = auVar37;
LAB_01cfbaaa:
  do {
    auVar47 = vshufps_avx(auVar42,auVar42,0x50);
    auVar219._8_4_ = 0x3f800000;
    auVar219._0_8_ = 0x3f8000003f800000;
    auVar219._12_4_ = 0x3f800000;
    auVar222._16_4_ = 0x3f800000;
    auVar222._0_16_ = auVar219;
    auVar222._20_4_ = 0x3f800000;
    auVar222._24_4_ = 0x3f800000;
    auVar222._28_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar219,auVar47);
    fVar202 = auVar47._0_4_;
    auVar119._0_4_ = local_2b8._0_4_ * fVar202;
    fVar92 = auVar47._4_4_;
    auVar119._4_4_ = local_2b8._4_4_ * fVar92;
    fVar197 = auVar47._8_4_;
    auVar119._8_4_ = local_2b8._8_4_ * fVar197;
    fVar198 = auVar47._12_4_;
    auVar119._12_4_ = local_2b8._12_4_ * fVar198;
    auVar127._0_4_ = local_2c8._0_4_ * fVar202;
    auVar127._4_4_ = local_2c8._4_4_ * fVar92;
    auVar127._8_4_ = local_2c8._8_4_ * fVar197;
    auVar127._12_4_ = local_2c8._12_4_ * fVar198;
    auVar140._0_4_ = local_2d8._0_4_ * fVar202;
    auVar140._4_4_ = local_2d8._4_4_ * fVar92;
    auVar140._8_4_ = local_2d8._8_4_ * fVar197;
    auVar140._12_4_ = local_2d8._12_4_ * fVar198;
    auVar104._0_4_ = local_2e8._0_4_ * fVar202;
    auVar104._4_4_ = local_2e8._4_4_ * fVar92;
    auVar104._8_4_ = local_2e8._8_4_ * fVar197;
    auVar104._12_4_ = local_2e8._12_4_ * fVar198;
    auVar49 = vfmadd231ps_fma(auVar119,auVar48,local_278);
    auVar43 = vfmadd231ps_fma(auVar127,auVar48,local_288);
    auVar39 = vfmadd231ps_avx512vl(auVar140,auVar48,local_298);
    auVar48 = vfmadd231ps_avx512vl(auVar104,local_2a8,auVar48);
    auVar47 = vmovshdup_avx(auVar37);
    fVar92 = auVar37._0_4_;
    fVar202 = (auVar47._0_4_ - fVar92) * 0.04761905;
    auVar162._4_4_ = fVar92;
    auVar162._0_4_ = fVar92;
    auVar162._8_4_ = fVar92;
    auVar162._12_4_ = fVar92;
    auVar162._16_4_ = fVar92;
    auVar162._20_4_ = fVar92;
    auVar162._24_4_ = fVar92;
    auVar162._28_4_ = fVar92;
    auVar116._0_8_ = auVar47._0_8_;
    auVar116._8_8_ = auVar116._0_8_;
    auVar116._16_8_ = auVar116._0_8_;
    auVar116._24_8_ = auVar116._0_8_;
    auVar61 = vsubps_avx(auVar116,auVar162);
    uVar93 = auVar49._0_4_;
    auVar117._4_4_ = uVar93;
    auVar117._0_4_ = uVar93;
    auVar117._8_4_ = uVar93;
    auVar117._12_4_ = uVar93;
    auVar117._16_4_ = uVar93;
    auVar117._20_4_ = uVar93;
    auVar117._24_4_ = uVar93;
    auVar117._28_4_ = uVar93;
    auVar181._8_4_ = 1;
    auVar181._0_8_ = 0x100000001;
    auVar181._12_4_ = 1;
    auVar181._16_4_ = 1;
    auVar181._20_4_ = 1;
    auVar181._24_4_ = 1;
    auVar181._28_4_ = 1;
    auVar76 = ZEXT1632(auVar49);
    auVar59 = vpermps_avx2(auVar181,auVar76);
    auVar66 = vbroadcastss_avx512vl(auVar43);
    auVar77 = ZEXT1632(auVar43);
    auVar60 = vpermps_avx512vl(auVar181,auVar77);
    auVar67 = vbroadcastss_avx512vl(auVar39);
    auVar74 = ZEXT1632(auVar39);
    auVar68 = vpermps_avx512vl(auVar181,auVar74);
    auVar69 = vbroadcastss_avx512vl(auVar48);
    auVar73 = ZEXT1632(auVar48);
    auVar70 = vpermps_avx512vl(auVar181,auVar73);
    auVar182._4_4_ = fVar202;
    auVar182._0_4_ = fVar202;
    auVar182._8_4_ = fVar202;
    auVar182._12_4_ = fVar202;
    auVar182._16_4_ = fVar202;
    auVar182._20_4_ = fVar202;
    auVar182._24_4_ = fVar202;
    auVar182._28_4_ = fVar202;
    auVar58 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar71 = vpermps_avx512vl(auVar58,auVar76);
    auVar153._8_4_ = 3;
    auVar153._0_8_ = 0x300000003;
    auVar153._12_4_ = 3;
    auVar153._16_4_ = 3;
    auVar153._20_4_ = 3;
    auVar153._24_4_ = 3;
    auVar153._28_4_ = 3;
    auVar72 = vpermps_avx512vl(auVar153,auVar76);
    auVar56 = vpermps_avx512vl(auVar58,auVar77);
    auVar76 = vpermps_avx2(auVar153,auVar77);
    auVar57 = vpermps_avx512vl(auVar58,auVar74);
    auVar77 = vpermps_avx2(auVar153,auVar74);
    auVar58 = vpermps_avx512vl(auVar58,auVar73);
    auVar73 = vpermps_avx512vl(auVar153,auVar73);
    auVar47 = vfmadd132ps_fma(auVar61,auVar162,_DAT_01faff20);
    auVar61 = vsubps_avx(auVar222,ZEXT1632(auVar47));
    auVar74 = vmulps_avx512vl(auVar66,ZEXT1632(auVar47));
    auVar78 = ZEXT1632(auVar47);
    auVar75 = vmulps_avx512vl(auVar60,auVar78);
    auVar48 = vfmadd231ps_fma(auVar74,auVar61,auVar117);
    auVar49 = vfmadd231ps_fma(auVar75,auVar61,auVar59);
    auVar74 = vmulps_avx512vl(auVar67,auVar78);
    auVar75 = vmulps_avx512vl(auVar68,auVar78);
    auVar66 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar66);
    auVar60 = vfmadd231ps_avx512vl(auVar75,auVar61,auVar60);
    auVar74 = vmulps_avx512vl(auVar69,auVar78);
    auVar75 = ZEXT1632(auVar47);
    auVar70 = vmulps_avx512vl(auVar70,auVar75);
    auVar67 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar68);
    fVar197 = auVar47._0_4_;
    fVar198 = auVar47._4_4_;
    auVar16._4_4_ = fVar198 * auVar66._4_4_;
    auVar16._0_4_ = fVar197 * auVar66._0_4_;
    fVar199 = auVar47._8_4_;
    auVar16._8_4_ = fVar199 * auVar66._8_4_;
    fVar200 = auVar47._12_4_;
    auVar16._12_4_ = fVar200 * auVar66._12_4_;
    auVar16._16_4_ = auVar66._16_4_ * 0.0;
    auVar16._20_4_ = auVar66._20_4_ * 0.0;
    auVar16._24_4_ = auVar66._24_4_ * 0.0;
    auVar16._28_4_ = fVar92;
    auVar17._4_4_ = fVar198 * auVar60._4_4_;
    auVar17._0_4_ = fVar197 * auVar60._0_4_;
    auVar17._8_4_ = fVar199 * auVar60._8_4_;
    auVar17._12_4_ = fVar200 * auVar60._12_4_;
    auVar17._16_4_ = auVar60._16_4_ * 0.0;
    auVar17._20_4_ = auVar60._20_4_ * 0.0;
    auVar17._24_4_ = auVar60._24_4_ * 0.0;
    auVar17._28_4_ = auVar59._28_4_;
    auVar48 = vfmadd231ps_fma(auVar16,auVar61,ZEXT1632(auVar48));
    auVar49 = vfmadd231ps_fma(auVar17,auVar61,ZEXT1632(auVar49));
    auVar109._0_4_ = fVar197 * auVar67._0_4_;
    auVar109._4_4_ = fVar198 * auVar67._4_4_;
    auVar109._8_4_ = fVar199 * auVar67._8_4_;
    auVar109._12_4_ = fVar200 * auVar67._12_4_;
    auVar109._16_4_ = auVar67._16_4_ * 0.0;
    auVar109._20_4_ = auVar67._20_4_ * 0.0;
    auVar109._24_4_ = auVar67._24_4_ * 0.0;
    auVar109._28_4_ = 0;
    auVar18._4_4_ = fVar198 * auVar68._4_4_;
    auVar18._0_4_ = fVar197 * auVar68._0_4_;
    auVar18._8_4_ = fVar199 * auVar68._8_4_;
    auVar18._12_4_ = fVar200 * auVar68._12_4_;
    auVar18._16_4_ = auVar68._16_4_ * 0.0;
    auVar18._20_4_ = auVar68._20_4_ * 0.0;
    auVar18._24_4_ = auVar68._24_4_ * 0.0;
    auVar18._28_4_ = auVar67._28_4_;
    auVar43 = vfmadd231ps_fma(auVar109,auVar61,auVar66);
    auVar39 = vfmadd231ps_fma(auVar18,auVar61,auVar60);
    auVar19._28_4_ = auVar60._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar200 * auVar39._12_4_,
                            CONCAT48(fVar199 * auVar39._8_4_,
                                     CONCAT44(fVar198 * auVar39._4_4_,fVar197 * auVar39._0_4_))));
    auVar38 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar43._12_4_,
                                                 CONCAT48(fVar199 * auVar43._8_4_,
                                                          CONCAT44(fVar198 * auVar43._4_4_,
                                                                   fVar197 * auVar43._0_4_)))),
                              auVar61,ZEXT1632(auVar48));
    auVar40 = vfmadd231ps_fma(auVar19,auVar61,ZEXT1632(auVar49));
    auVar59 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar48));
    auVar66 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar49));
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar59 = vmulps_avx512vl(auVar59,auVar60);
    auVar66 = vmulps_avx512vl(auVar66,auVar60);
    auVar175._0_4_ = fVar202 * auVar59._0_4_;
    auVar175._4_4_ = fVar202 * auVar59._4_4_;
    auVar175._8_4_ = fVar202 * auVar59._8_4_;
    auVar175._12_4_ = fVar202 * auVar59._12_4_;
    auVar175._16_4_ = fVar202 * auVar59._16_4_;
    auVar175._20_4_ = fVar202 * auVar59._20_4_;
    auVar175._24_4_ = fVar202 * auVar59._24_4_;
    auVar175._28_4_ = 0;
    auVar59 = vmulps_avx512vl(auVar182,auVar66);
    auVar49 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_01feed00,ZEXT1632(auVar49));
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01feed00,ZEXT1632(auVar49));
    auVar110._0_4_ = auVar175._0_4_ + auVar38._0_4_;
    auVar110._4_4_ = auVar175._4_4_ + auVar38._4_4_;
    auVar110._8_4_ = auVar175._8_4_ + auVar38._8_4_;
    auVar110._12_4_ = auVar175._12_4_ + auVar38._12_4_;
    auVar110._16_4_ = auVar175._16_4_ + 0.0;
    auVar110._20_4_ = auVar175._20_4_ + 0.0;
    auVar110._24_4_ = auVar175._24_4_ + 0.0;
    auVar110._28_4_ = 0;
    auVar78 = ZEXT1632(auVar49);
    auVar68 = vpermt2ps_avx512vl(auVar175,_DAT_01feed00,auVar78);
    auVar69 = vaddps_avx512vl(ZEXT1632(auVar40),auVar59);
    auVar70 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar78);
    auVar59 = vsubps_avx(auVar66,auVar68);
    auVar68 = vsubps_avx512vl(auVar67,auVar70);
    auVar70 = vmulps_avx512vl(auVar56,auVar75);
    auVar74 = vmulps_avx512vl(auVar76,auVar75);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar72);
    auVar72 = vmulps_avx512vl(auVar57,auVar75);
    auVar74 = vmulps_avx512vl(auVar77,auVar75);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar61,auVar56);
    auVar76 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar76);
    auVar58 = vmulps_avx512vl(auVar58,auVar75);
    auVar56 = vmulps_avx512vl(auVar73,auVar75);
    auVar48 = vfmadd231ps_fma(auVar58,auVar61,auVar57);
    auVar58 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar77);
    auVar56 = vmulps_avx512vl(auVar75,auVar72);
    auVar73 = ZEXT1632(auVar47);
    auVar57 = vmulps_avx512vl(auVar73,auVar76);
    auVar70 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar70);
    auVar71 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar71);
    auVar58 = vmulps_avx512vl(auVar73,auVar58);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar200 * auVar48._12_4_,
                                            CONCAT48(fVar199 * auVar48._8_4_,
                                                     CONCAT44(fVar198 * auVar48._4_4_,
                                                              fVar197 * auVar48._0_4_)))),auVar61,
                         auVar72);
    auVar76 = vfmadd231ps_avx512vl(auVar58,auVar61,auVar76);
    auVar20._4_4_ = fVar198 * auVar72._4_4_;
    auVar20._0_4_ = fVar197 * auVar72._0_4_;
    auVar20._8_4_ = fVar199 * auVar72._8_4_;
    auVar20._12_4_ = fVar200 * auVar72._12_4_;
    auVar20._16_4_ = auVar72._16_4_ * 0.0;
    auVar20._20_4_ = auVar72._20_4_ * 0.0;
    auVar20._24_4_ = auVar72._24_4_ * 0.0;
    auVar20._28_4_ = auVar77._28_4_;
    auVar77 = vmulps_avx512vl(auVar73,auVar76);
    auVar58 = vfmadd231ps_avx512vl(auVar20,auVar61,auVar70);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar61);
    auVar61 = vsubps_avx512vl(auVar72,auVar70);
    auVar76 = vsubps_avx512vl(auVar76,auVar71);
    auVar61 = vmulps_avx512vl(auVar61,auVar60);
    auVar76 = vmulps_avx512vl(auVar76,auVar60);
    fVar92 = fVar202 * auVar61._0_4_;
    fVar197 = fVar202 * auVar61._4_4_;
    auVar21._4_4_ = fVar197;
    auVar21._0_4_ = fVar92;
    fVar198 = fVar202 * auVar61._8_4_;
    auVar21._8_4_ = fVar198;
    fVar199 = fVar202 * auVar61._12_4_;
    auVar21._12_4_ = fVar199;
    fVar200 = fVar202 * auVar61._16_4_;
    auVar21._16_4_ = fVar200;
    fVar201 = fVar202 * auVar61._20_4_;
    auVar21._20_4_ = fVar201;
    fVar202 = fVar202 * auVar61._24_4_;
    auVar21._24_4_ = fVar202;
    auVar21._28_4_ = auVar61._28_4_;
    auVar76 = vmulps_avx512vl(auVar182,auVar76);
    auVar60 = vpermt2ps_avx512vl(auVar58,_DAT_01feed00,auVar78);
    auVar70 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar78);
    auVar183._0_4_ = auVar58._0_4_ + fVar92;
    auVar183._4_4_ = auVar58._4_4_ + fVar197;
    auVar183._8_4_ = auVar58._8_4_ + fVar198;
    auVar183._12_4_ = auVar58._12_4_ + fVar199;
    auVar183._16_4_ = auVar58._16_4_ + fVar200;
    auVar183._20_4_ = auVar58._20_4_ + fVar201;
    auVar183._24_4_ = auVar58._24_4_ + fVar202;
    auVar183._28_4_ = auVar58._28_4_ + auVar61._28_4_;
    auVar61 = vpermt2ps_avx512vl(auVar21,_DAT_01feed00,ZEXT1632(auVar49));
    auVar71 = vaddps_avx512vl(auVar77,auVar76);
    auVar76 = vpermt2ps_avx512vl(auVar76,_DAT_01feed00,ZEXT1632(auVar49));
    auVar61 = vsubps_avx(auVar60,auVar61);
    auVar76 = vsubps_avx512vl(auVar70,auVar76);
    in_ZMM17 = ZEXT3264(auVar76);
    auVar122 = ZEXT1632(auVar38);
    auVar72 = vsubps_avx512vl(auVar58,auVar122);
    auVar133 = ZEXT1632(auVar40);
    auVar56 = vsubps_avx512vl(auVar77,auVar133);
    auVar57 = vsubps_avx512vl(auVar60,auVar66);
    auVar72 = vaddps_avx512vl(auVar72,auVar57);
    auVar57 = vsubps_avx512vl(auVar70,auVar67);
    auVar56 = vaddps_avx512vl(auVar56,auVar57);
    auVar57 = vmulps_avx512vl(auVar133,auVar72);
    auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar122,auVar56);
    auVar73 = vmulps_avx512vl(auVar69,auVar72);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar110,auVar56);
    auVar74 = vmulps_avx512vl(auVar68,auVar72);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar59,auVar56);
    auVar75 = vmulps_avx512vl(auVar67,auVar72);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar66,auVar56);
    auVar78 = vmulps_avx512vl(auVar77,auVar72);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar58,auVar56);
    auVar79 = vmulps_avx512vl(auVar71,auVar72);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar183,auVar56);
    auVar80 = vmulps_avx512vl(auVar76,auVar72);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar61,auVar56);
    auVar72 = vmulps_avx512vl(auVar70,auVar72);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar60,auVar56);
    auVar56 = vminps_avx512vl(auVar57,auVar73);
    auVar57 = vmaxps_avx512vl(auVar57,auVar73);
    auVar73 = vminps_avx512vl(auVar74,auVar75);
    auVar56 = vminps_avx512vl(auVar56,auVar73);
    auVar73 = vmaxps_avx512vl(auVar74,auVar75);
    auVar57 = vmaxps_avx512vl(auVar57,auVar73);
    auVar73 = vminps_avx512vl(auVar78,auVar79);
    auVar74 = vmaxps_avx512vl(auVar78,auVar79);
    auVar75 = vminps_avx512vl(auVar80,auVar72);
    auVar73 = vminps_avx512vl(auVar73,auVar75);
    auVar56 = vminps_avx512vl(auVar56,auVar73);
    auVar72 = vmaxps_avx512vl(auVar80,auVar72);
    auVar72 = vmaxps_avx512vl(auVar74,auVar72);
    auVar72 = vmaxps_avx512vl(auVar57,auVar72);
    uVar10 = vcmpps_avx512vl(auVar56,local_b8,2);
    uVar11 = vcmpps_avx512vl(auVar72,local_d8,5);
    bVar29 = (byte)uVar10 & (byte)uVar11 & 0x7f;
    if (bVar29 != 0) {
      auVar72 = vsubps_avx512vl(auVar66,auVar122);
      auVar56 = vsubps_avx512vl(auVar67,auVar133);
      auVar57 = vsubps_avx512vl(auVar60,auVar58);
      auVar72 = vaddps_avx512vl(auVar72,auVar57);
      auVar57 = vsubps_avx512vl(auVar70,auVar77);
      auVar56 = vaddps_avx512vl(auVar56,auVar57);
      auVar57 = vmulps_avx512vl(auVar133,auVar72);
      auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar56,auVar122);
      auVar69 = vmulps_avx512vl(auVar69,auVar72);
      auVar69 = vfnmadd213ps_avx512vl(auVar110,auVar56,auVar69);
      auVar68 = vmulps_avx512vl(auVar68,auVar72);
      auVar68 = vfnmadd213ps_avx512vl(auVar59,auVar56,auVar68);
      auVar59 = vmulps_avx512vl(auVar67,auVar72);
      auVar67 = vfnmadd231ps_avx512vl(auVar59,auVar56,auVar66);
      auVar59 = vmulps_avx512vl(auVar77,auVar72);
      auVar77 = vfnmadd231ps_avx512vl(auVar59,auVar56,auVar58);
      auVar59 = vmulps_avx512vl(auVar71,auVar72);
      auVar58 = vfnmadd213ps_avx512vl(auVar183,auVar56,auVar59);
      auVar59 = vmulps_avx512vl(auVar76,auVar72);
      auVar71 = vfnmadd213ps_avx512vl(auVar61,auVar56,auVar59);
      auVar61 = vmulps_avx512vl(auVar70,auVar72);
      auVar60 = vfnmadd231ps_avx512vl(auVar61,auVar60,auVar56);
      auVar59 = vminps_avx(auVar57,auVar69);
      auVar61 = vmaxps_avx(auVar57,auVar69);
      auVar66 = vminps_avx(auVar68,auVar67);
      auVar66 = vminps_avx(auVar59,auVar66);
      auVar59 = vmaxps_avx(auVar68,auVar67);
      auVar61 = vmaxps_avx(auVar61,auVar59);
      auVar76 = vminps_avx(auVar77,auVar58);
      auVar59 = vmaxps_avx(auVar77,auVar58);
      auVar77 = vminps_avx(auVar71,auVar60);
      auVar76 = vminps_avx(auVar76,auVar77);
      auVar76 = vminps_avx(auVar66,auVar76);
      auVar66 = vmaxps_avx(auVar71,auVar60);
      auVar59 = vmaxps_avx(auVar59,auVar66);
      auVar61 = vmaxps_avx(auVar61,auVar59);
      uVar10 = vcmpps_avx512vl(auVar61,local_d8,5);
      uVar11 = vcmpps_avx512vl(auVar76,local_b8,2);
      bVar29 = bVar29 & (byte)uVar10 & (byte)uVar11;
      if (bVar29 != 0) {
        auStack_168[uVar27] = (uint)bVar29;
        uVar10 = vmovlps_avx(auVar37);
        (&uStack_98)[uVar27] = uVar10;
        uVar24 = vmovlps_avx(auVar42);
        auStack_58[uVar27] = uVar24;
        uVar27 = (ulong)((int)uVar27 + 1);
      }
    }
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar229 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar230 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar231 = ZEXT1664(auVar37);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar61);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar234 = ZEXT1664(auVar37);
    auVar235 = ZEXT3264(_DAT_01feed20);
    auVar74._16_16_ = DAT_01feed20._16_16_;
    auVar237 = ZEXT1664(local_328);
    auVar240 = ZEXT1664(local_338);
LAB_01cfbfb2:
    do {
      do {
        do {
          local_238.valid = &local_340;
          auVar47 = auVar229._0_16_;
          if ((int)uVar27 == 0) {
            if (bVar23) {
              return bVar23;
            }
            fVar202 = ray->tfar;
            auVar15._4_4_ = fVar202;
            auVar15._0_4_ = fVar202;
            auVar15._8_4_ = fVar202;
            auVar15._12_4_ = fVar202;
            auVar15._16_4_ = fVar202;
            auVar15._20_4_ = fVar202;
            auVar15._24_4_ = fVar202;
            auVar15._28_4_ = fVar202;
            uVar10 = vcmpps_avx512vl(local_78,auVar15,2);
            uVar32 = (uint)local_240 & (uint)local_308 & (uint)uVar10;
            local_240 = (ulong)uVar32;
            prim = local_300;
            if (uVar32 == 0) {
              return bVar23;
            }
            goto LAB_01cfb431;
          }
          uVar30 = (int)uVar27 - 1;
          uVar31 = (ulong)uVar30;
          uVar5 = auStack_168[uVar31];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = auStack_58[uVar31];
          uVar24 = 0;
          for (uVar26 = (ulong)uVar5; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
          {
            uVar24 = uVar24 + 1;
          }
          uVar25 = uVar5 - 1 & uVar5;
          bVar35 = uVar25 == 0;
          auStack_168[uVar31] = uVar25;
          if (bVar35) {
            uVar27 = (ulong)uVar30;
          }
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar24;
          auVar37 = vpunpcklqdq_avx(auVar94,ZEXT416((int)uVar24 + 1));
          auVar37 = vcvtqq2ps_avx512vl(auVar37);
          auVar37 = vmulps_avx512vl(auVar37,auVar233._0_16_);
          uVar93 = *(undefined4 *)((long)&uStack_98 + uVar31 * 8 + 4);
          auVar12._4_4_ = uVar93;
          auVar12._0_4_ = uVar93;
          auVar12._8_4_ = uVar93;
          auVar12._12_4_ = uVar93;
          auVar48 = vmulps_avx512vl(auVar37,auVar12);
          auVar49 = auVar234._0_16_;
          auVar37 = vsubps_avx512vl(auVar49,auVar37);
          uVar93 = *(undefined4 *)(&uStack_98 + uVar31);
          auVar13._4_4_ = uVar93;
          auVar13._0_4_ = uVar93;
          auVar13._8_4_ = uVar93;
          auVar13._12_4_ = uVar93;
          auVar37 = vfmadd231ps_avx512vl(auVar48,auVar37,auVar13);
          auVar48 = vmovshdup_avx(auVar37);
          fVar202 = auVar48._0_4_ - auVar37._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar202));
          if (uVar5 == 0 || bVar35) goto LAB_01cfbaaa;
          auVar48 = vshufps_avx(auVar42,auVar42,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar202));
          auVar38 = vsubps_avx512vl(auVar49,auVar48);
          fVar92 = auVar48._0_4_;
          auVar128._0_4_ = fVar92 * (float)local_2b8._0_4_;
          fVar197 = auVar48._4_4_;
          auVar128._4_4_ = fVar197 * (float)local_2b8._4_4_;
          fVar198 = auVar48._8_4_;
          auVar128._8_4_ = fVar198 * fStack_2b0;
          fVar199 = auVar48._12_4_;
          auVar128._12_4_ = fVar199 * fStack_2ac;
          auVar141._0_4_ = fVar92 * (float)local_2c8._0_4_;
          auVar141._4_4_ = fVar197 * (float)local_2c8._4_4_;
          auVar141._8_4_ = fVar198 * fStack_2c0;
          auVar141._12_4_ = fVar199 * fStack_2bc;
          auVar147._0_4_ = fVar92 * (float)local_2d8._0_4_;
          auVar147._4_4_ = fVar197 * (float)local_2d8._4_4_;
          auVar147._8_4_ = fVar198 * fStack_2d0;
          auVar147._12_4_ = fVar199 * fStack_2cc;
          auVar112._0_4_ = fVar92 * (float)local_2e8._0_4_;
          auVar112._4_4_ = fVar197 * (float)local_2e8._4_4_;
          auVar112._8_4_ = fVar198 * fStack_2e0;
          auVar112._12_4_ = fVar199 * fStack_2dc;
          auVar48 = vfmadd231ps_fma(auVar128,auVar38,local_278);
          auVar43 = vfmadd231ps_fma(auVar141,auVar38,local_288);
          auVar39 = vfmadd231ps_fma(auVar147,auVar38,local_298);
          auVar38 = vfmadd231ps_fma(auVar112,auVar38,local_2a8);
          auVar123._16_16_ = auVar48;
          auVar123._0_16_ = auVar48;
          auVar134._16_16_ = auVar43;
          auVar134._0_16_ = auVar43;
          auVar145._16_16_ = auVar39;
          auVar145._0_16_ = auVar39;
          auVar59 = vpermps_avx512vl(auVar235._0_32_,ZEXT1632(auVar37));
          auVar61 = vsubps_avx(auVar134,auVar123);
          auVar43 = vfmadd213ps_fma(auVar61,auVar59,auVar123);
          auVar61 = vsubps_avx(auVar145,auVar134);
          auVar40 = vfmadd213ps_fma(auVar61,auVar59,auVar134);
          auVar48 = vsubps_avx(auVar38,auVar39);
          auVar135._16_16_ = auVar48;
          auVar135._0_16_ = auVar48;
          auVar48 = vfmadd213ps_fma(auVar135,auVar59,auVar145);
          auVar61 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar43));
          auVar43 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar43));
          auVar61 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar40));
          auVar48 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar40));
          auVar61 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar43));
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar61,auVar59);
          auVar61 = vmulps_avx512vl(auVar61,auVar232._0_32_);
          auVar74._16_16_ = auVar61._16_16_;
          fVar92 = fVar202 * 0.33333334;
          auVar148._0_8_ =
               CONCAT44(auVar102._4_4_ + fVar92 * auVar61._4_4_,
                        auVar102._0_4_ + fVar92 * auVar61._0_4_);
          auVar148._8_4_ = auVar102._8_4_ + fVar92 * auVar61._8_4_;
          auVar148._12_4_ = auVar102._12_4_ + fVar92 * auVar61._12_4_;
          auVar129._0_4_ = fVar92 * auVar61._16_4_;
          auVar129._4_4_ = fVar92 * auVar61._20_4_;
          auVar129._8_4_ = fVar92 * auVar61._24_4_;
          auVar129._12_4_ = fVar92 * auVar61._28_4_;
          auVar46 = vsubps_avx((undefined1  [16])0x0,auVar129);
          auVar40 = vshufpd_avx(auVar102,auVar102,3);
          auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar48 = vsubps_avx(auVar40,auVar102);
          auVar43 = vsubps_avx(auVar41,(undefined1  [16])0x0);
          auVar167._0_4_ = auVar48._0_4_ + auVar43._0_4_;
          auVar167._4_4_ = auVar48._4_4_ + auVar43._4_4_;
          auVar167._8_4_ = auVar48._8_4_ + auVar43._8_4_;
          auVar167._12_4_ = auVar48._12_4_ + auVar43._12_4_;
          auVar48 = vshufps_avx(auVar102,auVar102,0xb1);
          auVar43 = vshufps_avx(auVar148,auVar148,0xb1);
          auVar39 = vshufps_avx(auVar46,auVar46,0xb1);
          auVar38 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar220._4_4_ = auVar167._0_4_;
          auVar220._0_4_ = auVar167._0_4_;
          auVar220._8_4_ = auVar167._0_4_;
          auVar220._12_4_ = auVar167._0_4_;
          auVar44 = vshufps_avx(auVar167,auVar167,0x55);
          fVar92 = auVar44._0_4_;
          auVar179._0_4_ = auVar48._0_4_ * fVar92;
          fVar197 = auVar44._4_4_;
          auVar179._4_4_ = auVar48._4_4_ * fVar197;
          fVar198 = auVar44._8_4_;
          auVar179._8_4_ = auVar48._8_4_ * fVar198;
          fVar199 = auVar44._12_4_;
          auVar179._12_4_ = auVar48._12_4_ * fVar199;
          auVar189._0_4_ = auVar43._0_4_ * fVar92;
          auVar189._4_4_ = auVar43._4_4_ * fVar197;
          auVar189._8_4_ = auVar43._8_4_ * fVar198;
          auVar189._12_4_ = auVar43._12_4_ * fVar199;
          auVar205._0_4_ = auVar39._0_4_ * fVar92;
          auVar205._4_4_ = auVar39._4_4_ * fVar197;
          auVar205._8_4_ = auVar39._8_4_ * fVar198;
          auVar205._12_4_ = auVar39._12_4_ * fVar199;
          auVar168._0_4_ = auVar38._0_4_ * fVar92;
          auVar168._4_4_ = auVar38._4_4_ * fVar197;
          auVar168._8_4_ = auVar38._8_4_ * fVar198;
          auVar168._12_4_ = auVar38._12_4_ * fVar199;
          auVar48 = vfmadd231ps_fma(auVar179,auVar220,auVar102);
          auVar43 = vfmadd231ps_fma(auVar189,auVar220,auVar148);
          auVar52 = vfmadd231ps_fma(auVar205,auVar220,auVar46);
          auVar53 = vfmadd231ps_fma(auVar168,(undefined1  [16])0x0,auVar220);
          auVar44 = vshufpd_avx(auVar48,auVar48,1);
          auVar45 = vshufpd_avx(auVar43,auVar43,1);
          auVar50 = vshufpd_avx512vl(auVar52,auVar52,1);
          auVar51 = vshufpd_avx512vl(auVar53,auVar53,1);
          in_ZMM17 = ZEXT1664(auVar51);
          auVar39 = vminss_avx(auVar48,auVar43);
          auVar48 = vmaxss_avx(auVar43,auVar48);
          auVar38 = vminss_avx(auVar52,auVar53);
          auVar43 = vmaxss_avx(auVar53,auVar52);
          auVar39 = vminss_avx(auVar39,auVar38);
          auVar48 = vmaxss_avx(auVar43,auVar48);
          auVar38 = vminss_avx(auVar44,auVar45);
          auVar43 = vmaxss_avx(auVar45,auVar44);
          auVar44 = vminss_avx512f(auVar50,auVar51);
          auVar45 = vmaxss_avx512f(auVar51,auVar50);
          auVar43 = vmaxss_avx(auVar45,auVar43);
          auVar38 = vminss_avx512f(auVar38,auVar44);
          fVar197 = auVar43._0_4_;
          fVar92 = auVar48._0_4_;
          if (auVar39._0_4_ < 0.0001) {
            bVar36 = fVar197 == -0.0001;
            bVar33 = NAN(fVar197);
            if (fVar197 <= -0.0001) goto LAB_01cfc1e7;
            break;
          }
LAB_01cfc1e7:
          vucomiss_avx512f(auVar38);
          bVar36 = fVar197 <= -0.0001;
          bVar34 = -0.0001 < fVar92;
          bVar33 = bVar36;
          if (!bVar36) break;
          uVar24 = vcmpps_avx512vl(auVar39,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar26 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar22 = (uVar24 & uVar26 & 1) == 0;
          bVar36 = bVar34 && bVar22;
          bVar33 = bVar34 && (uVar24 & uVar26 & 1) == 0;
        } while (!bVar34 || !bVar22);
        auVar52 = vxorps_avx512vl(auVar236._0_16_,auVar236._0_16_);
        vcmpss_avx512f(auVar39,auVar52,1);
        uVar10 = vcmpss_avx512f(auVar48,auVar52,1);
        bVar34 = (bool)((byte)uVar10 & 1);
        auVar74._0_16_ = auVar239._0_16_;
        auVar81._4_28_ = auVar74._4_28_;
        auVar81._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * auVar239._0_4_);
        vucomiss_avx512f(auVar81._0_16_);
        bVar33 = (bool)(!bVar36 | bVar33);
        bVar34 = bVar33 == false;
        auVar83._16_16_ = auVar74._16_16_;
        auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar82._4_28_ = auVar83._4_28_;
        auVar82._0_4_ = (uint)bVar33 * auVar52._0_4_ + (uint)!bVar33 * 0x7f800000;
        auVar45 = auVar82._0_16_;
        auVar85._16_16_ = auVar74._16_16_;
        auVar85._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar84._4_28_ = auVar85._4_28_;
        auVar84._0_4_ = (uint)bVar33 * auVar52._0_4_ + (uint)!bVar33 * -0x800000;
        auVar44 = auVar84._0_16_;
        auVar53 = vxorps_avx512vl(auVar238._0_16_,auVar238._0_16_);
        uVar10 = vcmpss_avx512f(auVar38,auVar52,1);
        bVar36 = (bool)((byte)uVar10 & 1);
        auVar87._16_16_ = auVar74._16_16_;
        auVar87._0_16_ = auVar239._0_16_;
        auVar86._4_28_ = auVar87._4_28_;
        auVar86._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar239._0_4_);
        auVar52 = vucomiss_avx512f(auVar86._0_16_);
        in_ZMM17 = ZEXT1664(auVar52);
        if ((bVar33) || (bVar34)) {
          auVar38 = vucomiss_avx512f(auVar39);
          if ((bVar33) || (bVar34)) {
            auVar52 = vxorps_avx512vl(auVar39,auVar231._0_16_);
            in_ZMM17 = ZEXT1664(auVar52);
            auVar39 = vsubss_avx512f(auVar38,auVar39);
            auVar39 = vdivss_avx512f(auVar52,auVar39);
            auVar38 = vsubss_avx512f(ZEXT416(0x3f800000),auVar39);
            auVar38 = vfmadd213ss_avx512f(auVar38,auVar53,auVar39);
            auVar39 = auVar38;
          }
          else {
            auVar38 = vxorps_avx512vl(auVar38,auVar38);
            vucomiss_avx512f(auVar38);
            if ((bVar33) || (auVar39 = ZEXT416(0x3f800000), bVar34)) {
              auVar38 = ZEXT416(0x7f800000);
              auVar39 = SUB6416(ZEXT464(0xff800000),0);
            }
          }
          auVar45 = vminss_avx512f(auVar45,auVar38);
          auVar44 = vmaxss_avx(auVar39,auVar44);
        }
        auVar239 = ZEXT464(0x3f800000);
        auVar238 = ZEXT1664(local_2f8);
        auVar236 = ZEXT1664(local_318);
        auVar39 = vxorps_avx512vl(auVar38,auVar38);
        uVar10 = vcmpss_avx512f(auVar43,auVar39,1);
        bVar36 = (bool)((byte)uVar10 & 1);
        auVar43 = auVar239._0_16_;
        fVar198 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * 0x3f800000);
        if ((auVar81._0_4_ != fVar198) || (NAN(auVar81._0_4_) || NAN(fVar198))) {
          if ((fVar197 != fVar92) || (NAN(fVar197) || NAN(fVar92))) {
            auVar48 = vxorps_avx512vl(auVar48,auVar231._0_16_);
            auVar169._0_4_ = auVar48._0_4_ / (fVar197 - fVar92);
            auVar169._4_12_ = auVar48._4_12_;
            auVar48 = vsubss_avx512f(auVar43,auVar169);
            auVar48 = vfmadd213ss_avx512f(auVar48,auVar39,auVar169);
            auVar38 = auVar48;
          }
          else if ((fVar92 != 0.0) ||
                  (auVar48 = auVar43, auVar38 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
            auVar48 = SUB6416(ZEXT464(0xff800000),0);
            auVar38 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar45 = vminss_avx(auVar45,auVar38);
          auVar44 = vmaxss_avx(auVar48,auVar44);
        }
        bVar36 = auVar86._0_4_ != fVar198;
        auVar48 = vminss_avx512f(auVar45,auVar43);
        auVar89._16_16_ = auVar74._16_16_;
        auVar89._0_16_ = auVar45;
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar36 * auVar48._0_4_ + (uint)!bVar36 * auVar45._0_4_;
        auVar48 = vmaxss_avx512f(auVar43,auVar44);
        auVar91._16_16_ = auVar74._16_16_;
        auVar91._0_16_ = auVar44;
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar36 * auVar48._0_4_ + (uint)!bVar36 * auVar44._0_4_;
        auVar48 = vmaxss_avx512f(auVar39,auVar88._0_16_);
        auVar38 = vminss_avx512f(auVar90._0_16_,auVar43);
      } while (auVar38._0_4_ < auVar48._0_4_);
      auVar52 = vmaxss_avx512f(auVar39,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
      auVar53 = vminss_avx512f(ZEXT416((uint)(auVar38._0_4_ + 0.1)),auVar43);
      auVar113._0_8_ = auVar102._0_8_;
      auVar113._8_8_ = auVar113._0_8_;
      auVar190._8_8_ = auVar148._0_8_;
      auVar190._0_8_ = auVar148._0_8_;
      auVar206._8_8_ = auVar46._0_8_;
      auVar206._0_8_ = auVar46._0_8_;
      auVar48 = vshufpd_avx(auVar148,auVar148,3);
      auVar39 = vshufpd_avx(auVar46,auVar46,3);
      auVar38 = vshufps_avx(auVar52,auVar53,0);
      auVar46 = vsubps_avx512vl(auVar49,auVar38);
      fVar92 = auVar38._0_4_;
      auVar142._0_4_ = fVar92 * auVar40._0_4_;
      fVar197 = auVar38._4_4_;
      auVar142._4_4_ = fVar197 * auVar40._4_4_;
      fVar198 = auVar38._8_4_;
      auVar142._8_4_ = fVar198 * auVar40._8_4_;
      fVar199 = auVar38._12_4_;
      auVar142._12_4_ = fVar199 * auVar40._12_4_;
      auVar149._0_4_ = fVar92 * auVar48._0_4_;
      auVar149._4_4_ = fVar197 * auVar48._4_4_;
      auVar149._8_4_ = fVar198 * auVar48._8_4_;
      auVar149._12_4_ = fVar199 * auVar48._12_4_;
      auVar223._0_4_ = auVar39._0_4_ * fVar92;
      auVar223._4_4_ = auVar39._4_4_ * fVar197;
      auVar223._8_4_ = auVar39._8_4_ * fVar198;
      auVar223._12_4_ = auVar39._12_4_ * fVar199;
      auVar130._0_4_ = fVar92 * auVar41._0_4_;
      auVar130._4_4_ = fVar197 * auVar41._4_4_;
      auVar130._8_4_ = fVar198 * auVar41._8_4_;
      auVar130._12_4_ = fVar199 * auVar41._12_4_;
      auVar41 = vfmadd231ps_fma(auVar142,auVar46,auVar113);
      auVar44 = vfmadd231ps_fma(auVar149,auVar46,auVar190);
      auVar45 = vfmadd231ps_fma(auVar223,auVar46,auVar206);
      auVar46 = vfmadd231ps_fma(auVar130,auVar46,ZEXT816(0));
      auVar39 = vsubss_avx512f(auVar43,auVar52);
      auVar48 = vmovshdup_avx(auVar42);
      auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar52._0_4_)),auVar42,auVar39);
      auVar39 = vsubss_avx512f(auVar43,auVar53);
      auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar53._0_4_)),auVar42,auVar39);
      auVar42 = vdivss_avx512f(auVar43,ZEXT416((uint)fVar202));
      auVar48 = vsubps_avx(auVar44,auVar41);
      auVar38 = vmulps_avx512vl(auVar48,auVar47);
      auVar48 = vsubps_avx(auVar45,auVar44);
      auVar40 = vmulps_avx512vl(auVar48,auVar47);
      auVar48 = vsubps_avx(auVar46,auVar45);
      auVar48 = vmulps_avx512vl(auVar48,auVar47);
      auVar39 = vminps_avx(auVar40,auVar48);
      auVar48 = vmaxps_avx(auVar40,auVar48);
      auVar39 = vminps_avx(auVar38,auVar39);
      auVar48 = vmaxps_avx(auVar38,auVar48);
      auVar38 = vshufpd_avx(auVar39,auVar39,3);
      auVar40 = vshufpd_avx(auVar48,auVar48,3);
      auVar39 = vminps_avx(auVar39,auVar38);
      auVar48 = vmaxps_avx(auVar48,auVar40);
      fVar202 = auVar42._0_4_;
      auVar170._0_4_ = auVar39._0_4_ * fVar202;
      auVar170._4_4_ = auVar39._4_4_ * fVar202;
      auVar170._8_4_ = auVar39._8_4_ * fVar202;
      auVar170._12_4_ = auVar39._12_4_ * fVar202;
      auVar158._0_4_ = fVar202 * auVar48._0_4_;
      auVar158._4_4_ = fVar202 * auVar48._4_4_;
      auVar158._8_4_ = fVar202 * auVar48._8_4_;
      auVar158._12_4_ = fVar202 * auVar48._12_4_;
      auVar52 = vdivss_avx512f(auVar43,ZEXT416((uint)(auVar50._0_4_ - auVar102._0_4_)));
      auVar48 = vshufpd_avx(auVar41,auVar41,3);
      auVar39 = vshufpd_avx(auVar44,auVar44,3);
      auVar38 = vshufpd_avx(auVar45,auVar45,3);
      auVar40 = vshufpd_avx(auVar46,auVar46,3);
      auVar48 = vsubps_avx(auVar48,auVar41);
      auVar41 = vsubps_avx(auVar39,auVar44);
      auVar42 = vsubps_avx(auVar38,auVar45);
      auVar40 = vsubps_avx(auVar40,auVar46);
      auVar39 = vminps_avx(auVar48,auVar41);
      auVar48 = vmaxps_avx(auVar48,auVar41);
      auVar38 = vminps_avx(auVar42,auVar40);
      auVar38 = vminps_avx(auVar39,auVar38);
      auVar39 = vmaxps_avx(auVar42,auVar40);
      auVar48 = vmaxps_avx(auVar48,auVar39);
      fVar202 = auVar52._0_4_;
      auVar207._0_4_ = fVar202 * auVar38._0_4_;
      auVar207._4_4_ = fVar202 * auVar38._4_4_;
      auVar207._8_4_ = fVar202 * auVar38._8_4_;
      auVar207._12_4_ = fVar202 * auVar38._12_4_;
      auVar191._0_4_ = fVar202 * auVar48._0_4_;
      auVar191._4_4_ = fVar202 * auVar48._4_4_;
      auVar191._8_4_ = fVar202 * auVar48._8_4_;
      auVar191._12_4_ = fVar202 * auVar48._12_4_;
      auVar40 = vinsertps_avx(auVar37,auVar102,0x10);
      auVar51 = vpermt2ps_avx512vl(auVar37,_DAT_01feecd0,auVar50);
      auVar103._0_4_ = auVar40._0_4_ + auVar51._0_4_;
      auVar103._4_4_ = auVar40._4_4_ + auVar51._4_4_;
      auVar103._8_4_ = auVar40._8_4_ + auVar51._8_4_;
      auVar103._12_4_ = auVar40._12_4_ + auVar51._12_4_;
      auVar14._8_4_ = 0x3f000000;
      auVar14._0_8_ = 0x3f0000003f000000;
      auVar14._12_4_ = 0x3f000000;
      auVar46 = vmulps_avx512vl(auVar103,auVar14);
      auVar39 = vshufps_avx(auVar46,auVar46,0x54);
      uVar93 = auVar46._0_4_;
      auVar105._4_4_ = uVar93;
      auVar105._0_4_ = uVar93;
      auVar105._8_4_ = uVar93;
      auVar105._12_4_ = uVar93;
      auVar41 = vfmadd213ps_avx512vl(auVar237._0_16_,auVar105,local_2f8);
      auVar42 = vfmadd213ps_avx512vl(auVar240._0_16_,auVar105,local_318);
      auVar38 = vfmadd213ps_fma(local_e8,auVar105,local_268);
      auVar48 = vsubps_avx(auVar42,auVar41);
      auVar41 = vfmadd213ps_fma(auVar48,auVar105,auVar41);
      auVar48 = vsubps_avx(auVar38,auVar42);
      auVar48 = vfmadd213ps_fma(auVar48,auVar105,auVar42);
      auVar48 = vsubps_avx(auVar48,auVar41);
      auVar38 = vfmadd231ps_fma(auVar41,auVar48,auVar105);
      auVar44 = vmulps_avx512vl(auVar48,auVar47);
      auVar214._8_8_ = auVar38._0_8_;
      auVar214._0_8_ = auVar38._0_8_;
      auVar48 = vshufpd_avx(auVar38,auVar38,3);
      auVar38 = vshufps_avx(auVar46,auVar46,0x55);
      auVar41 = vsubps_avx(auVar48,auVar214);
      auVar42 = vfmadd231ps_fma(auVar214,auVar38,auVar41);
      auVar224._8_8_ = auVar44._0_8_;
      auVar224._0_8_ = auVar44._0_8_;
      auVar48 = vshufpd_avx(auVar44,auVar44,3);
      auVar48 = vsubps_avx512vl(auVar48,auVar224);
      auVar48 = vfmadd213ps_avx512vl(auVar48,auVar38,auVar224);
      auVar106._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
      auVar106._8_4_ = auVar41._8_4_ ^ 0x80000000;
      auVar106._12_4_ = auVar41._12_4_ ^ 0x80000000;
      auVar38 = vmovshdup_avx512vl(auVar48);
      auVar225._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar225._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar225._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar44 = vmovshdup_avx512vl(auVar41);
      auVar236 = ZEXT464(5);
      auVar45 = vpermt2ps_avx512vl(auVar225,ZEXT416(5),auVar41);
      auVar38 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar41._0_4_)),auVar48,auVar44);
      auVar41 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar106);
      auVar131._0_4_ = auVar38._0_4_;
      auVar131._4_4_ = auVar131._0_4_;
      auVar131._8_4_ = auVar131._0_4_;
      auVar131._12_4_ = auVar131._0_4_;
      auVar48 = vdivps_avx(auVar45,auVar131);
      auVar54 = vdivps_avx512vl(auVar41,auVar131);
      fVar202 = auVar42._0_4_;
      auVar38 = vshufps_avx(auVar42,auVar42,0x55);
      auVar215._0_4_ = fVar202 * auVar48._0_4_ + auVar38._0_4_ * auVar54._0_4_;
      auVar215._4_4_ = fVar202 * auVar48._4_4_ + auVar38._4_4_ * auVar54._4_4_;
      auVar215._8_4_ = fVar202 * auVar48._8_4_ + auVar38._8_4_ * auVar54._8_4_;
      auVar215._12_4_ = fVar202 * auVar48._12_4_ + auVar38._12_4_ * auVar54._12_4_;
      auVar52 = vsubps_avx(auVar39,auVar215);
      auVar38 = vmovshdup_avx(auVar48);
      auVar39 = vinsertps_avx(auVar170,auVar207,0x1c);
      auVar226._0_4_ = auVar38._0_4_ * auVar39._0_4_;
      auVar226._4_4_ = auVar38._4_4_ * auVar39._4_4_;
      auVar226._8_4_ = auVar38._8_4_ * auVar39._8_4_;
      auVar226._12_4_ = auVar38._12_4_ * auVar39._12_4_;
      auVar53 = vinsertps_avx512f(auVar158,auVar191,0x1c);
      auVar38 = vmulps_avx512vl(auVar38,auVar53);
      auVar45 = vminps_avx512vl(auVar226,auVar38);
      auVar42 = vmaxps_avx(auVar38,auVar226);
      auVar44 = vmovshdup_avx(auVar54);
      auVar38 = vinsertps_avx(auVar207,auVar170,0x4c);
      auVar208._0_4_ = auVar44._0_4_ * auVar38._0_4_;
      auVar208._4_4_ = auVar44._4_4_ * auVar38._4_4_;
      auVar208._8_4_ = auVar44._8_4_ * auVar38._8_4_;
      auVar208._12_4_ = auVar44._12_4_ * auVar38._12_4_;
      auVar41 = vinsertps_avx(auVar191,auVar158,0x4c);
      auVar192._0_4_ = auVar44._0_4_ * auVar41._0_4_;
      auVar192._4_4_ = auVar44._4_4_ * auVar41._4_4_;
      auVar192._8_4_ = auVar44._8_4_ * auVar41._8_4_;
      auVar192._12_4_ = auVar44._12_4_ * auVar41._12_4_;
      auVar44 = vminps_avx(auVar208,auVar192);
      auVar45 = vaddps_avx512vl(auVar45,auVar44);
      auVar44 = vmaxps_avx(auVar192,auVar208);
      auVar193._0_4_ = auVar42._0_4_ + auVar44._0_4_;
      auVar193._4_4_ = auVar42._4_4_ + auVar44._4_4_;
      auVar193._8_4_ = auVar42._8_4_ + auVar44._8_4_;
      auVar193._12_4_ = auVar42._12_4_ + auVar44._12_4_;
      auVar209._8_8_ = 0x3f80000000000000;
      auVar209._0_8_ = 0x3f80000000000000;
      auVar42 = vsubps_avx(auVar209,auVar193);
      auVar44 = vsubps_avx(auVar209,auVar45);
      auVar45 = vsubps_avx(auVar40,auVar46);
      auVar46 = vsubps_avx(auVar51,auVar46);
      fVar199 = auVar45._0_4_;
      auVar227._0_4_ = fVar199 * auVar42._0_4_;
      fVar200 = auVar45._4_4_;
      auVar227._4_4_ = fVar200 * auVar42._4_4_;
      fVar201 = auVar45._8_4_;
      auVar227._8_4_ = fVar201 * auVar42._8_4_;
      fVar101 = auVar45._12_4_;
      auVar227._12_4_ = fVar101 * auVar42._12_4_;
      auVar55 = vbroadcastss_avx512vl(auVar48);
      auVar39 = vmulps_avx512vl(auVar55,auVar39);
      auVar53 = vmulps_avx512vl(auVar55,auVar53);
      auVar55 = vminps_avx512vl(auVar39,auVar53);
      auVar53 = vmaxps_avx512vl(auVar53,auVar39);
      auVar39 = vbroadcastss_avx512vl(auVar54);
      auVar38 = vmulps_avx512vl(auVar39,auVar38);
      auVar39 = vmulps_avx512vl(auVar39,auVar41);
      auVar41 = vminps_avx512vl(auVar38,auVar39);
      auVar41 = vaddps_avx512vl(auVar55,auVar41);
      auVar45 = vmulps_avx512vl(auVar45,auVar44);
      in_ZMM17 = ZEXT1664(auVar45);
      fVar202 = auVar46._0_4_;
      auVar194._0_4_ = fVar202 * auVar42._0_4_;
      fVar92 = auVar46._4_4_;
      auVar194._4_4_ = fVar92 * auVar42._4_4_;
      fVar197 = auVar46._8_4_;
      auVar194._8_4_ = fVar197 * auVar42._8_4_;
      fVar198 = auVar46._12_4_;
      auVar194._12_4_ = fVar198 * auVar42._12_4_;
      auVar210._0_4_ = fVar202 * auVar44._0_4_;
      auVar210._4_4_ = fVar92 * auVar44._4_4_;
      auVar210._8_4_ = fVar197 * auVar44._8_4_;
      auVar210._12_4_ = fVar198 * auVar44._12_4_;
      auVar39 = vmaxps_avx(auVar39,auVar38);
      auVar159._0_4_ = auVar53._0_4_ + auVar39._0_4_;
      auVar159._4_4_ = auVar53._4_4_ + auVar39._4_4_;
      auVar159._8_4_ = auVar53._8_4_ + auVar39._8_4_;
      auVar159._12_4_ = auVar53._12_4_ + auVar39._12_4_;
      auVar171._8_8_ = 0x3f800000;
      auVar171._0_8_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar171,auVar159);
      auVar38 = vsubps_avx512vl(auVar171,auVar41);
      auVar221._0_4_ = fVar199 * auVar39._0_4_;
      auVar221._4_4_ = fVar200 * auVar39._4_4_;
      auVar221._8_4_ = fVar201 * auVar39._8_4_;
      auVar221._12_4_ = fVar101 * auVar39._12_4_;
      auVar216._0_4_ = fVar199 * auVar38._0_4_;
      auVar216._4_4_ = fVar200 * auVar38._4_4_;
      auVar216._8_4_ = fVar201 * auVar38._8_4_;
      auVar216._12_4_ = fVar101 * auVar38._12_4_;
      auVar160._0_4_ = fVar202 * auVar39._0_4_;
      auVar160._4_4_ = fVar92 * auVar39._4_4_;
      auVar160._8_4_ = fVar197 * auVar39._8_4_;
      auVar160._12_4_ = fVar198 * auVar39._12_4_;
      auVar172._0_4_ = fVar202 * auVar38._0_4_;
      auVar172._4_4_ = fVar92 * auVar38._4_4_;
      auVar172._8_4_ = fVar197 * auVar38._8_4_;
      auVar172._12_4_ = fVar198 * auVar38._12_4_;
      auVar39 = vminps_avx(auVar221,auVar216);
      auVar38 = vminps_avx512vl(auVar160,auVar172);
      auVar41 = vminps_avx512vl(auVar39,auVar38);
      auVar39 = vmaxps_avx(auVar216,auVar221);
      auVar38 = vmaxps_avx(auVar172,auVar160);
      auVar38 = vmaxps_avx(auVar38,auVar39);
      auVar42 = vminps_avx512vl(auVar227,auVar45);
      auVar39 = vminps_avx(auVar194,auVar210);
      auVar39 = vminps_avx(auVar42,auVar39);
      auVar39 = vhaddps_avx(auVar41,auVar39);
      auVar42 = vmaxps_avx512vl(auVar45,auVar227);
      auVar41 = vmaxps_avx(auVar210,auVar194);
      auVar41 = vmaxps_avx(auVar41,auVar42);
      auVar38 = vhaddps_avx(auVar38,auVar41);
      auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
      auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
      auVar161._0_4_ = auVar39._0_4_ + auVar52._0_4_;
      auVar161._4_4_ = auVar39._4_4_ + auVar52._4_4_;
      auVar161._8_4_ = auVar39._8_4_ + auVar52._8_4_;
      auVar161._12_4_ = auVar39._12_4_ + auVar52._12_4_;
      auVar173._0_4_ = auVar38._0_4_ + auVar52._0_4_;
      auVar173._4_4_ = auVar38._4_4_ + auVar52._4_4_;
      auVar173._8_4_ = auVar38._8_4_ + auVar52._8_4_;
      auVar173._12_4_ = auVar38._12_4_ + auVar52._12_4_;
      auVar39 = vmaxps_avx(auVar40,auVar161);
      auVar38 = vminps_avx(auVar173,auVar51);
      uVar24 = vcmpps_avx512vl(auVar38,auVar39,1);
    } while ((uVar24 & 3) != 0);
    uVar24 = vcmpps_avx512vl(auVar173,auVar51,1);
    uVar10 = vcmpps_avx512vl(auVar37,auVar161,1);
    if (((ushort)uVar10 & (ushort)uVar24 & 1) == 0) {
      bVar29 = 0;
    }
    else {
      auVar39 = vmovshdup_avx(auVar161);
      bVar29 = auVar102._0_4_ < auVar39._0_4_ & (byte)(uVar24 >> 1) & 0x7f;
    }
    auVar236 = ZEXT1664(local_318);
    if (((3 < (uint)uVar27 || uVar5 != 0 && !bVar35) | bVar29) == 1) {
      lVar28 = 200;
      do {
        auVar37 = vsubss_avx512f(auVar43,auVar52);
        fVar197 = auVar37._0_4_;
        fVar202 = fVar197 * fVar197 * fVar197;
        fVar198 = auVar52._0_4_;
        fVar92 = fVar198 * 3.0 * fVar197 * fVar197;
        fVar197 = fVar197 * fVar198 * fVar198 * 3.0;
        auVar120._4_4_ = fVar202;
        auVar120._0_4_ = fVar202;
        auVar120._8_4_ = fVar202;
        auVar120._12_4_ = fVar202;
        auVar114._4_4_ = fVar92;
        auVar114._0_4_ = fVar92;
        auVar114._8_4_ = fVar92;
        auVar114._12_4_ = fVar92;
        auVar95._4_4_ = fVar197;
        auVar95._0_4_ = fVar197;
        auVar95._8_4_ = fVar197;
        auVar95._12_4_ = fVar197;
        fVar198 = fVar198 * fVar198 * fVar198;
        auVar143._0_4_ = (float)local_178._0_4_ * fVar198;
        auVar143._4_4_ = (float)local_178._4_4_ * fVar198;
        auVar143._8_4_ = fStack_170 * fVar198;
        auVar143._12_4_ = fStack_16c * fVar198;
        auVar37 = vfmadd231ps_fma(auVar143,local_268,auVar95);
        auVar37 = vfmadd231ps_avx512vl(auVar37,local_318,auVar114);
        auVar37 = vfmadd231ps_avx512vl(auVar37,local_2f8,auVar120);
        auVar96._8_8_ = auVar37._0_8_;
        auVar96._0_8_ = auVar37._0_8_;
        auVar37 = vshufpd_avx(auVar37,auVar37,3);
        auVar39 = vshufps_avx(auVar52,auVar52,0x55);
        auVar37 = vsubps_avx(auVar37,auVar96);
        auVar39 = vfmadd213ps_fma(auVar37,auVar39,auVar96);
        fVar202 = auVar39._0_4_;
        auVar37 = vshufps_avx(auVar39,auVar39,0x55);
        auVar97._0_4_ = auVar48._0_4_ * fVar202 + auVar54._0_4_ * auVar37._0_4_;
        auVar97._4_4_ = auVar48._4_4_ * fVar202 + auVar54._4_4_ * auVar37._4_4_;
        auVar97._8_4_ = auVar48._8_4_ * fVar202 + auVar54._8_4_ * auVar37._8_4_;
        auVar97._12_4_ = auVar48._12_4_ * fVar202 + auVar54._12_4_ * auVar37._12_4_;
        auVar52 = vsubps_avx(auVar52,auVar97);
        auVar37 = vandps_avx512vl(auVar39,auVar230._0_16_);
        auVar39 = vprolq_avx512vl(auVar37,0x20);
        auVar37 = vmaxss_avx(auVar39,auVar37);
        if (auVar37._0_4_ < (float)local_188._0_4_) {
          fVar202 = auVar52._0_4_;
          if (0.0 <= fVar202) {
            auVar37 = vucomiss_avx512f(auVar52);
            auVar239 = ZEXT1664(auVar37);
            if (0.0 <= fVar202) {
              auVar37 = vmovshdup_avx(auVar52);
              fVar92 = auVar37._0_4_;
              if (0.0 <= fVar92) {
                auVar48 = vucomiss_avx512f(auVar37);
                auVar239 = ZEXT1664(auVar48);
                if (0.0 <= fVar92) {
                  auVar43 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
                  auVar45 = vinsertps_avx(auVar43,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2])
                                          ,0x28);
                  aVar1 = (ray->org).field_0;
                  auVar43 = vsubps_avx(local_198,(undefined1  [16])aVar1);
                  auVar43 = vdpps_avx(auVar43,auVar45,0x7f);
                  auVar39 = vsubps_avx(local_1d8,(undefined1  [16])aVar1);
                  auVar39 = vdpps_avx(auVar39,auVar45,0x7f);
                  auVar38 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                  auVar38 = vdpps_avx(auVar38,auVar45,0x7f);
                  auVar40 = vsubps_avx(local_1b8,(undefined1  [16])aVar1);
                  auVar40 = vdpps_avx(auVar40,auVar45,0x7f);
                  auVar41 = vsubps_avx(_local_1a8,(undefined1  [16])aVar1);
                  auVar41 = vdpps_avx(auVar41,auVar45,0x7f);
                  auVar42 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
                  auVar42 = vdpps_avx(auVar42,auVar45,0x7f);
                  auVar44 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
                  auVar44 = vdpps_avx(auVar44,auVar45,0x7f);
                  auVar46 = vsubps_avx(_local_1c8,(undefined1  [16])aVar1);
                  auVar45 = vdpps_avx(auVar46,auVar45,0x7f);
                  auVar46 = vsubss_avx512f(auVar48,auVar37);
                  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar92)),auVar46,auVar43)
                  ;
                  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * fVar92)),auVar46,auVar39)
                  ;
                  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar92)),auVar46,auVar38)
                  ;
                  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar45._0_4_)),auVar46,auVar40)
                  ;
                  auVar48 = vsubss_avx512f(auVar48,auVar52);
                  auVar144._0_4_ = auVar48._0_4_;
                  fVar92 = auVar144._0_4_ * auVar144._0_4_ * auVar144._0_4_;
                  fVar197 = fVar202 * 3.0 * auVar144._0_4_ * auVar144._0_4_;
                  fVar198 = auVar144._0_4_ * fVar202 * fVar202 * 3.0;
                  fVar200 = fVar202 * fVar202 * fVar202;
                  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar38._0_4_)),
                                            ZEXT416((uint)fVar198),auVar39);
                  auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar197),auVar43);
                  auVar37 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar92),auVar37);
                  fVar199 = auVar37._0_4_;
                  if (((ray->org).field_0.m128[3] <= fVar199) &&
                     (local_33c = ray->tfar, fVar199 <= local_33c)) {
                    auVar37 = vshufps_avx(auVar52,auVar52,0x55);
                    auVar43 = vsubps_avx512vl(auVar49,auVar37);
                    fVar201 = auVar37._0_4_;
                    auVar174._0_4_ = fVar201 * (float)local_1a8._0_4_;
                    fVar101 = auVar37._4_4_;
                    auVar174._4_4_ = fVar101 * (float)local_1a8._4_4_;
                    fVar111 = auVar37._8_4_;
                    auVar174._8_4_ = fVar111 * fStack_1a0;
                    fVar98 = auVar37._12_4_;
                    auVar174._12_4_ = fVar98 * fStack_19c;
                    auVar180._0_4_ = fVar201 * (float)local_1f8._0_4_;
                    auVar180._4_4_ = fVar101 * (float)local_1f8._4_4_;
                    auVar180._8_4_ = fVar111 * fStack_1f0;
                    auVar180._12_4_ = fVar98 * fStack_1ec;
                    auVar195._0_4_ = fVar201 * (float)local_208._0_4_;
                    auVar195._4_4_ = fVar101 * (float)local_208._4_4_;
                    auVar195._8_4_ = fVar111 * fStack_200;
                    auVar195._12_4_ = fVar98 * fStack_1fc;
                    auVar150._0_4_ = fVar201 * (float)local_1c8._0_4_;
                    auVar150._4_4_ = fVar101 * (float)local_1c8._4_4_;
                    auVar150._8_4_ = fVar111 * fStack_1c0;
                    auVar150._12_4_ = fVar98 * fStack_1bc;
                    auVar37 = vfmadd231ps_fma(auVar174,auVar43,local_198);
                    auVar48 = vfmadd231ps_fma(auVar180,auVar43,local_1d8);
                    auVar49 = vfmadd231ps_fma(auVar195,auVar43,local_1e8);
                    auVar43 = vfmadd231ps_fma(auVar150,auVar43,local_1b8);
                    auVar37 = vsubps_avx(auVar48,auVar37);
                    auVar48 = vsubps_avx(auVar49,auVar48);
                    auVar49 = vsubps_avx(auVar43,auVar49);
                    auVar196._0_4_ = fVar202 * auVar48._0_4_;
                    auVar196._4_4_ = fVar202 * auVar48._4_4_;
                    auVar196._8_4_ = fVar202 * auVar48._8_4_;
                    auVar196._12_4_ = fVar202 * auVar48._12_4_;
                    auVar144._4_4_ = auVar144._0_4_;
                    auVar144._8_4_ = auVar144._0_4_;
                    auVar144._12_4_ = auVar144._0_4_;
                    auVar37 = vfmadd231ps_fma(auVar196,auVar144,auVar37);
                    auVar151._0_4_ = fVar202 * auVar49._0_4_;
                    auVar151._4_4_ = fVar202 * auVar49._4_4_;
                    auVar151._8_4_ = fVar202 * auVar49._8_4_;
                    auVar151._12_4_ = fVar202 * auVar49._12_4_;
                    auVar48 = vfmadd231ps_fma(auVar151,auVar144,auVar48);
                    auVar152._0_4_ = fVar202 * auVar48._0_4_;
                    auVar152._4_4_ = fVar202 * auVar48._4_4_;
                    auVar152._8_4_ = fVar202 * auVar48._8_4_;
                    auVar152._12_4_ = fVar202 * auVar48._12_4_;
                    auVar37 = vfmadd231ps_fma(auVar152,auVar144,auVar37);
                    auVar37 = vmulps_avx512vl(auVar37,auVar47);
                    pGVar6 = (context->scene->geometries).items[uVar32].ptr;
                    if ((pGVar6->mask & ray->mask) == 0) {
LAB_01cfcdf8:
                      bVar29 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar29 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar132._0_4_ = fVar200 * (float)local_128._0_4_;
                      auVar132._4_4_ = fVar200 * (float)local_128._4_4_;
                      auVar132._8_4_ = fVar200 * fStack_120;
                      auVar132._12_4_ = fVar200 * fStack_11c;
                      auVar121._4_4_ = fVar198;
                      auVar121._0_4_ = fVar198;
                      auVar121._8_4_ = fVar198;
                      auVar121._12_4_ = fVar198;
                      auVar47 = vfmadd132ps_fma(auVar121,auVar132,local_118);
                      auVar115._4_4_ = fVar197;
                      auVar115._0_4_ = fVar197;
                      auVar115._8_4_ = fVar197;
                      auVar115._12_4_ = fVar197;
                      auVar47 = vfmadd132ps_fma(auVar115,auVar47,local_108);
                      auVar107._4_4_ = fVar92;
                      auVar107._0_4_ = fVar92;
                      auVar107._8_4_ = fVar92;
                      auVar107._12_4_ = fVar92;
                      auVar49 = vfmadd132ps_fma(auVar107,auVar47,local_f8);
                      auVar47 = vshufps_avx(auVar49,auVar49,0xc9);
                      auVar48 = vshufps_avx(auVar37,auVar37,0xc9);
                      auVar108._0_4_ = auVar49._0_4_ * auVar48._0_4_;
                      auVar108._4_4_ = auVar49._4_4_ * auVar48._4_4_;
                      auVar108._8_4_ = auVar49._8_4_ * auVar48._8_4_;
                      auVar108._12_4_ = auVar49._12_4_ * auVar48._12_4_;
                      auVar47 = vfmsub231ps_fma(auVar108,auVar37,auVar47);
                      auVar37 = vshufps_avx(auVar47,auVar47,0xe9);
                      local_158 = vmovlps_avx(auVar37);
                      local_150 = auVar47._0_4_;
                      local_14c = vmovlps_avx(auVar52);
                      local_144 = (int)local_248;
                      local_140 = uVar32;
                      local_13c = context->user->instID[0];
                      local_138 = context->user->instPrimID[0];
                      ray->tfar = fVar199;
                      local_340 = -1;
                      local_238.geometryUserPtr = pGVar6->userPtr;
                      local_238.context = context->user;
                      local_238.hit = (RTCHitN *)&local_158;
                      local_238.N = 1;
                      local_238.ray = (RTCRayN *)ray;
                      if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        local_250 = context;
                        (*pGVar6->occlusionFilterN)(&local_238);
                        auVar240 = ZEXT1664(local_338);
                        auVar237 = ZEXT1664(local_328);
                        auVar239 = ZEXT464(0x3f800000);
                        auVar235 = ZEXT3264(_DAT_01feed20);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar234 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar233 = ZEXT1664(auVar37);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar232 = ZEXT3264(auVar61);
                        auVar74._16_16_ = auVar61._16_16_;
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar231 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar230 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar229 = ZEXT1664(auVar37);
                        context = local_250;
                        if (*local_238.valid != 0) goto LAB_01cfcd24;
LAB_01cfcdeb:
                        auVar239 = ZEXT464(0x3f800000);
                        ray->tfar = local_33c;
                        goto LAB_01cfcdf8;
                      }
LAB_01cfcd24:
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_238);
                        auVar240 = ZEXT1664(local_338);
                        auVar237 = ZEXT1664(local_328);
                        auVar239 = ZEXT464(0x3f800000);
                        auVar235 = ZEXT3264(_DAT_01feed20);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar234 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar233 = ZEXT1664(auVar37);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar232 = ZEXT3264(auVar61);
                        auVar74._16_16_ = auVar61._16_16_;
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar231 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar230 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar229 = ZEXT1664(auVar37);
                        if (*local_238.valid == 0) goto LAB_01cfcdeb;
                      }
                      bVar29 = 1;
                    }
                    bVar23 = (bool)(bVar23 | bVar29);
                  }
                }
              }
            }
          }
          break;
        }
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      goto LAB_01cfbfb2;
    }
    auVar42 = vinsertps_avx(auVar102,auVar50,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }